

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

void embree::avx512::CurveNiMBIntersector1<4>::
     intersect_t<embree::avx512::RibbonCurve1Intersector1<embree::BSplineCurveT,8>,embree::avx512::Intersect1EpilogMU<8,true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  Primitive PVar7;
  int iVar8;
  __int_type_conflict _Var9;
  long lVar10;
  RTCFilterFunctionN p_Var11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined8 uVar24;
  ulong uVar25;
  uint uVar26;
  long lVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  byte bVar70;
  ulong uVar71;
  uint uVar72;
  uint uVar73;
  Geometry *pGVar74;
  RayQueryContext *pRVar75;
  long lVar76;
  uint uVar77;
  long lVar78;
  ulong uVar79;
  byte bVar80;
  ulong uVar81;
  float fVar82;
  float fVar83;
  float fVar134;
  float fVar136;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar93 [16];
  float fVar135;
  float fVar137;
  float fVar139;
  float fVar140;
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  float fVar138;
  float fVar141;
  float fVar142;
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined4 uVar143;
  float fVar153;
  float fVar154;
  vint4 bi_2;
  float fVar155;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined8 uVar156;
  vint4 bi_1;
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [32];
  float fVar165;
  float fVar179;
  vint4 bi;
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar180 [16];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  vint4 ai_2;
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [64];
  vint4 ai_1;
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [64];
  undefined1 auVar202 [64];
  vint4 ai;
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [64];
  undefined1 auVar208 [64];
  undefined1 auVar209 [16];
  float fVar210;
  undefined1 auVar211 [16];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [16];
  undefined1 auVar222 [64];
  undefined1 auVar223 [64];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::BSplineCurveT<embree::Vec3fx>,_8> bhit;
  int local_53c;
  RayQueryContext *local_538;
  ulong local_530;
  ulong local_528;
  Primitive *local_520;
  Precalculations *local_518;
  RTCFilterFunctionNArguments local_510;
  undefined1 local_4e0 [8];
  undefined8 uStack_4d8;
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [16];
  undefined1 local_4b0 [16];
  undefined8 local_4a0;
  undefined4 local_498;
  float local_494;
  undefined4 local_490;
  undefined4 local_48c;
  undefined4 local_488;
  uint local_484;
  uint local_480;
  Geometry *local_468;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  undefined4 uStack_3a4;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined4 local_260;
  int local_25c;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  float local_200 [4];
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_190 [16];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  float local_100;
  float fStack_fc;
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar7 = prim[1];
  uVar71 = (ulong)(byte)PVar7;
  lVar27 = uVar71 * 0x25;
  fVar165 = *(float *)(prim + lVar27 + 0x12);
  auVar89 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                       *(undefined1 (*) [16])(prim + lVar27 + 6));
  auVar166._0_4_ = fVar165 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar166._4_4_ = fVar165 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar166._8_4_ = fVar165 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar166._12_4_ = fVar165 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar88 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 * 4 + 6)));
  auVar184._0_4_ = fVar165 * auVar89._0_4_;
  auVar184._4_4_ = fVar165 * auVar89._4_4_;
  auVar184._8_4_ = fVar165 * auVar89._8_4_;
  auVar184._12_4_ = fVar165 * auVar89._12_4_;
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar89 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 * 5 + 6)));
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar85 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 * 6 + 6)));
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 * 0xf + 6)));
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar7 * 0x10 + 6)));
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar86 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar7 * 0x10 + uVar71 + 6)));
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 * 0x1a + 6)));
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 * 0x1b + 6)));
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar87 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 * 0x1c + 6)));
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar199._4_4_ = auVar166._0_4_;
  auVar199._0_4_ = auVar166._0_4_;
  auVar199._8_4_ = auVar166._0_4_;
  auVar199._12_4_ = auVar166._0_4_;
  auVar22 = vshufps_avx(auVar166,auVar166,0x55);
  auVar23 = vshufps_avx(auVar166,auVar166,0xaa);
  fVar165 = auVar23._0_4_;
  auVar167._0_4_ = fVar165 * auVar85._0_4_;
  fVar153 = auVar23._4_4_;
  auVar167._4_4_ = fVar153 * auVar85._4_4_;
  fVar154 = auVar23._8_4_;
  auVar167._8_4_ = fVar154 * auVar85._8_4_;
  fVar155 = auVar23._12_4_;
  auVar167._12_4_ = fVar155 * auVar85._12_4_;
  auVar157._0_4_ = auVar86._0_4_ * fVar165;
  auVar157._4_4_ = auVar86._4_4_ * fVar153;
  auVar157._8_4_ = auVar86._8_4_ * fVar154;
  auVar157._12_4_ = auVar86._12_4_ * fVar155;
  auVar93._0_4_ = auVar87._0_4_ * fVar165;
  auVar93._4_4_ = auVar87._4_4_ * fVar153;
  auVar93._8_4_ = auVar87._8_4_ * fVar154;
  auVar93._12_4_ = auVar87._12_4_ * fVar155;
  auVar23 = vfmadd231ps_fma(auVar167,auVar22,auVar89);
  auVar28 = vfmadd231ps_fma(auVar157,auVar22,auVar19);
  auVar22 = vfmadd231ps_fma(auVar93,auVar21,auVar22);
  auVar23 = vfmadd231ps_fma(auVar23,auVar199,auVar88);
  auVar28 = vfmadd231ps_fma(auVar28,auVar199,auVar18);
  auVar29 = vfmadd231ps_fma(auVar22,auVar20,auVar199);
  auVar217._4_4_ = auVar184._0_4_;
  auVar217._0_4_ = auVar184._0_4_;
  auVar217._8_4_ = auVar184._0_4_;
  auVar217._12_4_ = auVar184._0_4_;
  auVar22 = vshufps_avx(auVar184,auVar184,0x55);
  auVar84 = vshufps_avx512vl(auVar184,auVar184,0xaa);
  auVar85 = vmulps_avx512vl(auVar84,auVar85);
  auVar86 = vmulps_avx512vl(auVar84,auVar86);
  auVar87 = vmulps_avx512vl(auVar84,auVar87);
  auVar89 = vfmadd231ps_fma(auVar85,auVar22,auVar89);
  auVar85 = vfmadd231ps_fma(auVar86,auVar22,auVar19);
  auVar19 = vfmadd231ps_fma(auVar87,auVar22,auVar21);
  auVar30 = vfmadd231ps_fma(auVar89,auVar217,auVar88);
  auVar93 = vfmadd231ps_fma(auVar85,auVar217,auVar18);
  auVar88 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar222 = ZEXT1664(auVar88);
  auVar144 = vfmadd231ps_fma(auVar19,auVar217,auVar20);
  auVar89 = vandps_avx512vl(auVar23,auVar88);
  auVar205._8_4_ = 0x219392ef;
  auVar205._0_8_ = 0x219392ef219392ef;
  auVar205._12_4_ = 0x219392ef;
  uVar79 = vcmpps_avx512vl(auVar89,auVar205,1);
  bVar12 = (bool)((byte)uVar79 & 1);
  auVar90._0_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar23._0_4_;
  bVar12 = (bool)((byte)(uVar79 >> 1) & 1);
  auVar90._4_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar23._4_4_;
  bVar12 = (bool)((byte)(uVar79 >> 2) & 1);
  auVar90._8_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar23._8_4_;
  bVar12 = (bool)((byte)(uVar79 >> 3) & 1);
  auVar90._12_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar23._12_4_;
  auVar89 = vandps_avx512vl(auVar28,auVar88);
  uVar79 = vcmpps_avx512vl(auVar89,auVar205,1);
  bVar12 = (bool)((byte)uVar79 & 1);
  auVar91._0_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar28._0_4_;
  bVar12 = (bool)((byte)(uVar79 >> 1) & 1);
  auVar91._4_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar28._4_4_;
  bVar12 = (bool)((byte)(uVar79 >> 2) & 1);
  auVar91._8_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar28._8_4_;
  bVar12 = (bool)((byte)(uVar79 >> 3) & 1);
  auVar91._12_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar28._12_4_;
  auVar88 = vandps_avx512vl(auVar29,auVar88);
  uVar79 = vcmpps_avx512vl(auVar88,auVar205,1);
  bVar12 = (bool)((byte)uVar79 & 1);
  auVar92._0_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar29._0_4_;
  bVar12 = (bool)((byte)(uVar79 >> 1) & 1);
  auVar92._4_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar29._4_4_;
  bVar12 = (bool)((byte)(uVar79 >> 2) & 1);
  auVar92._8_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar29._8_4_;
  bVar12 = (bool)((byte)(uVar79 >> 3) & 1);
  auVar92._12_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar29._12_4_;
  auVar89 = vrcp14ps_avx512vl(auVar90);
  auVar206._8_4_ = 0x3f800000;
  auVar206._0_8_ = 0x3f8000003f800000;
  auVar206._12_4_ = 0x3f800000;
  auVar88 = vfnmadd213ps_fma(auVar90,auVar89,auVar206);
  auVar29 = vfmadd132ps_fma(auVar88,auVar89,auVar89);
  auVar89 = vrcp14ps_avx512vl(auVar91);
  auVar88 = vfnmadd213ps_fma(auVar91,auVar89,auVar206);
  auVar84 = vfmadd132ps_fma(auVar88,auVar89,auVar89);
  auVar89 = vrcp14ps_avx512vl(auVar92);
  auVar88 = vfnmadd213ps_fma(auVar92,auVar89,auVar206);
  auVar221 = vfmadd132ps_fma(auVar88,auVar89,auVar89);
  fVar165 = ((ray->super_RayK<1>).dir.field_0.m128[3] - *(float *)(prim + lVar27 + 0x16)) *
            *(float *)(prim + lVar27 + 0x1a);
  auVar203._4_4_ = fVar165;
  auVar203._0_4_ = fVar165;
  auVar203._8_4_ = fVar165;
  auVar203._12_4_ = fVar165;
  auVar88._8_8_ = 0;
  auVar88._0_8_ = *(ulong *)(prim + uVar71 * 7 + 6);
  auVar88 = vpmovsxwd_avx(auVar88);
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar89._8_8_ = 0;
  auVar89._0_8_ = *(ulong *)(prim + uVar71 * 0xb + 6);
  auVar89 = vpmovsxwd_avx(auVar89);
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar18 = vsubps_avx(auVar89,auVar88);
  auVar85._8_8_ = 0;
  auVar85._0_8_ = *(ulong *)(prim + uVar71 * 9 + 6);
  auVar89 = vpmovsxwd_avx(auVar85);
  auVar85 = vfmadd213ps_fma(auVar18,auVar203,auVar88);
  auVar88 = vcvtdq2ps_avx(auVar89);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar71 * 0xd + 6);
  auVar89 = vpmovsxwd_avx(auVar18);
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar89 = vsubps_avx(auVar89,auVar88);
  auVar18 = vfmadd213ps_fma(auVar89,auVar203,auVar88);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar71 * 0x12 + 6);
  auVar88 = vpmovsxwd_avx(auVar19);
  auVar88 = vcvtdq2ps_avx(auVar88);
  uVar79 = (ulong)(uint)((int)(uVar71 * 5) << 2);
  auVar86._8_8_ = 0;
  auVar86._0_8_ = *(ulong *)(prim + uVar71 * 2 + uVar79 + 6);
  auVar89 = vpmovsxwd_avx(auVar86);
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar89 = vsubps_avx(auVar89,auVar88);
  auVar19 = vfmadd213ps_fma(auVar89,auVar203,auVar88);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar79 + 6);
  auVar88 = vpmovsxwd_avx(auVar20);
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar71 * 0x18 + 6);
  auVar89 = vpmovsxwd_avx(auVar21);
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar89 = vsubps_avx(auVar89,auVar88);
  auVar86 = vfmadd213ps_fma(auVar89,auVar203,auVar88);
  auVar87._8_8_ = 0;
  auVar87._0_8_ = *(ulong *)(prim + uVar71 * 0x1d + 6);
  auVar88 = vpmovsxwd_avx(auVar87);
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar71 + (ulong)(byte)PVar7 * 0x20 + 6);
  auVar89 = vpmovsxwd_avx(auVar22);
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar89 = vsubps_avx(auVar89,auVar88);
  auVar20 = vfmadd213ps_fma(auVar89,auVar203,auVar88);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar7 * 0x20 - uVar71) + 6);
  auVar88 = vpmovsxwd_avx(auVar23);
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = *(ulong *)(prim + uVar71 * 0x23 + 6);
  auVar89 = vpmovsxwd_avx(auVar28);
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar89 = vsubps_avx(auVar89,auVar88);
  auVar89 = vfmadd213ps_fma(auVar89,auVar203,auVar88);
  auVar88 = vsubps_avx(auVar85,auVar30);
  auVar204._0_4_ = auVar29._0_4_ * auVar88._0_4_;
  auVar204._4_4_ = auVar29._4_4_ * auVar88._4_4_;
  auVar204._8_4_ = auVar29._8_4_ * auVar88._8_4_;
  auVar204._12_4_ = auVar29._12_4_ * auVar88._12_4_;
  auVar88 = vsubps_avx(auVar18,auVar30);
  auVar168._0_4_ = auVar29._0_4_ * auVar88._0_4_;
  auVar168._4_4_ = auVar29._4_4_ * auVar88._4_4_;
  auVar168._8_4_ = auVar29._8_4_ * auVar88._8_4_;
  auVar168._12_4_ = auVar29._12_4_ * auVar88._12_4_;
  auVar88 = vsubps_avx(auVar19,auVar93);
  auVar200._0_4_ = auVar84._0_4_ * auVar88._0_4_;
  auVar200._4_4_ = auVar84._4_4_ * auVar88._4_4_;
  auVar200._8_4_ = auVar84._8_4_ * auVar88._8_4_;
  auVar200._12_4_ = auVar84._12_4_ * auVar88._12_4_;
  auVar88 = vsubps_avx(auVar86,auVar93);
  auVar158._0_4_ = auVar84._0_4_ * auVar88._0_4_;
  auVar158._4_4_ = auVar84._4_4_ * auVar88._4_4_;
  auVar158._8_4_ = auVar84._8_4_ * auVar88._8_4_;
  auVar158._12_4_ = auVar84._12_4_ * auVar88._12_4_;
  auVar88 = vsubps_avx(auVar20,auVar144);
  auVar185._0_4_ = auVar221._0_4_ * auVar88._0_4_;
  auVar185._4_4_ = auVar221._4_4_ * auVar88._4_4_;
  auVar185._8_4_ = auVar221._8_4_ * auVar88._8_4_;
  auVar185._12_4_ = auVar221._12_4_ * auVar88._12_4_;
  auVar88 = vsubps_avx(auVar89,auVar144);
  auVar144._0_4_ = auVar221._0_4_ * auVar88._0_4_;
  auVar144._4_4_ = auVar221._4_4_ * auVar88._4_4_;
  auVar144._8_4_ = auVar221._8_4_ * auVar88._8_4_;
  auVar144._12_4_ = auVar221._12_4_ * auVar88._12_4_;
  auVar88 = vpminsd_avx(auVar204,auVar168);
  auVar89 = vpminsd_avx(auVar200,auVar158);
  auVar88 = vmaxps_avx(auVar88,auVar89);
  auVar89 = vpminsd_avx(auVar185,auVar144);
  uVar143 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar29._4_4_ = uVar143;
  auVar29._0_4_ = uVar143;
  auVar29._8_4_ = uVar143;
  auVar29._12_4_ = uVar143;
  auVar89 = vmaxps_avx512vl(auVar89,auVar29);
  auVar88 = vmaxps_avx(auVar88,auVar89);
  auVar84._8_4_ = 0x3f7ffffa;
  auVar84._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar84._12_4_ = 0x3f7ffffa;
  local_190 = vmulps_avx512vl(auVar88,auVar84);
  auVar88 = vpmaxsd_avx(auVar204,auVar168);
  auVar89 = vpmaxsd_avx(auVar200,auVar158);
  auVar88 = vminps_avx(auVar88,auVar89);
  auVar89 = vpmaxsd_avx(auVar185,auVar144);
  fVar165 = (ray->super_RayK<1>).tfar;
  auVar221._4_4_ = fVar165;
  auVar221._0_4_ = fVar165;
  auVar221._8_4_ = fVar165;
  auVar221._12_4_ = fVar165;
  auVar89 = vminps_avx512vl(auVar89,auVar221);
  auVar88 = vminps_avx(auVar88,auVar89);
  auVar30._8_4_ = 0x3f800003;
  auVar30._0_8_ = 0x3f8000033f800003;
  auVar30._12_4_ = 0x3f800003;
  auVar88 = vmulps_avx512vl(auVar88,auVar30);
  local_518 = pre;
  auVar89 = vpbroadcastd_avx512vl();
  uVar156 = vcmpps_avx512vl(local_190,auVar88,2);
  uVar79 = vpcmpgtd_avx512vl(auVar89,_DAT_01f7fcf0);
  uVar79 = ((byte)uVar156 & 0xf) & uVar79;
  if ((char)uVar79 != '\0') {
    auVar223 = ZEXT464(0xbf800000);
    local_520 = prim;
    local_538 = context;
    do {
      lVar27 = 0;
      for (uVar71 = uVar79; (uVar71 & 1) == 0; uVar71 = uVar71 >> 1 | 0x8000000000000000) {
        lVar27 = lVar27 + 1;
      }
      uVar77 = *(uint *)(prim + 2);
      uVar73 = *(uint *)(prim + lVar27 * 4 + 6);
      local_530 = (ulong)uVar77;
      pGVar74 = (context->scene->geometries).items[uVar77].ptr;
      local_528 = (ulong)uVar73;
      uVar71 = (ulong)*(uint *)(*(long *)&pGVar74->field_0x58 +
                               (ulong)uVar73 *
                               pGVar74[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      fVar165 = (pGVar74->time_range).lower;
      fVar165 = pGVar74->fnumTimeSegments *
                (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar165) /
                ((pGVar74->time_range).upper - fVar165));
      auVar88 = vroundss_avx(ZEXT416((uint)fVar165),ZEXT416((uint)fVar165),9);
      auVar89 = vaddss_avx512f(ZEXT416((uint)pGVar74->fnumTimeSegments),auVar223._0_16_);
      auVar88 = vminss_avx(auVar88,auVar89);
      auVar88 = vmaxss_avx(ZEXT816(0) << 0x20,auVar88);
      fVar165 = fVar165 - auVar88._0_4_;
      _Var9 = pGVar74[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar78 = (long)(int)auVar88._0_4_ * 0x38;
      lVar27 = *(long *)(_Var9 + 0x10 + lVar78);
      lVar76 = *(long *)(_Var9 + 0x38 + lVar78);
      lVar10 = *(long *)(_Var9 + 0x48 + lVar78);
      auVar159._4_4_ = fVar165;
      auVar159._0_4_ = fVar165;
      auVar159._8_4_ = fVar165;
      auVar159._12_4_ = fVar165;
      pfVar3 = (float *)(lVar76 + uVar71 * lVar10);
      auVar209._0_4_ = fVar165 * *pfVar3;
      auVar209._4_4_ = fVar165 * pfVar3[1];
      auVar209._8_4_ = fVar165 * pfVar3[2];
      auVar209._12_4_ = fVar165 * pfVar3[3];
      pfVar3 = (float *)(lVar76 + (uVar71 + 1) * lVar10);
      auVar211._0_4_ = fVar165 * *pfVar3;
      auVar211._4_4_ = fVar165 * pfVar3[1];
      auVar211._8_4_ = fVar165 * pfVar3[2];
      auVar211._12_4_ = fVar165 * pfVar3[3];
      auVar88 = vmulps_avx512vl(auVar159,*(undefined1 (*) [16])(lVar76 + (uVar71 + 2) * lVar10));
      auVar89 = vmulps_avx512vl(auVar159,*(undefined1 (*) [16])(lVar76 + lVar10 * (uVar71 + 3)));
      lVar76 = *(long *)(_Var9 + lVar78);
      fVar165 = 1.0 - fVar165;
      auVar145._4_4_ = fVar165;
      auVar145._0_4_ = fVar165;
      auVar145._8_4_ = fVar165;
      auVar145._12_4_ = fVar165;
      local_4b0 = vfmadd231ps_fma(auVar209,auVar145,*(undefined1 (*) [16])(lVar76 + lVar27 * uVar71)
                                 );
      local_4c0 = vfmadd231ps_fma(auVar211,auVar145,
                                  *(undefined1 (*) [16])(lVar76 + lVar27 * (uVar71 + 1)));
      local_4d0 = vfmadd231ps_avx512vl
                            (auVar88,auVar145,*(undefined1 (*) [16])(lVar76 + lVar27 * (uVar71 + 2))
                            );
      _local_4e0 = vfmadd231ps_avx512vl
                             (auVar89,auVar145,
                              *(undefined1 (*) [16])(lVar76 + lVar27 * (uVar71 + 3)));
      iVar8 = (int)pGVar74[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar27 = (long)iVar8 * 0x44;
      aVar4 = (ray->super_RayK<1>).org.field_0;
      auVar89 = vsubps_avx(local_4b0,(undefined1  [16])aVar4);
      uVar143 = auVar89._0_4_;
      auVar160._4_4_ = uVar143;
      auVar160._0_4_ = uVar143;
      auVar160._8_4_ = uVar143;
      auVar160._12_4_ = uVar143;
      auVar88 = vshufps_avx(auVar89,auVar89,0x55);
      aVar5 = (local_518->ray_space).vx.field_0;
      aVar6 = (local_518->ray_space).vy.field_0;
      auVar89 = vshufps_avx(auVar89,auVar89,0xaa);
      fVar165 = (local_518->ray_space).vz.field_0.m128[0];
      fVar153 = (local_518->ray_space).vz.field_0.m128[1];
      fVar154 = (local_518->ray_space).vz.field_0.m128[2];
      fVar155 = (local_518->ray_space).vz.field_0.m128[3];
      auVar214._0_4_ = auVar89._0_4_ * fVar165;
      auVar214._4_4_ = auVar89._4_4_ * fVar153;
      auVar214._8_4_ = auVar89._8_4_ * fVar154;
      auVar214._12_4_ = auVar89._12_4_ * fVar155;
      auVar88 = vfmadd231ps_fma(auVar214,(undefined1  [16])aVar6,auVar88);
      auVar85 = vfmadd231ps_fma(auVar88,(undefined1  [16])aVar5,auVar160);
      auVar89 = vsubps_avx(local_4c0,(undefined1  [16])aVar4);
      uVar143 = auVar89._0_4_;
      auVar161._4_4_ = uVar143;
      auVar161._0_4_ = uVar143;
      auVar161._8_4_ = uVar143;
      auVar161._12_4_ = uVar143;
      auVar88 = vshufps_avx(auVar89,auVar89,0x55);
      auVar89 = vshufps_avx(auVar89,auVar89,0xaa);
      auVar215._0_4_ = auVar89._0_4_ * fVar165;
      auVar215._4_4_ = auVar89._4_4_ * fVar153;
      auVar215._8_4_ = auVar89._8_4_ * fVar154;
      auVar215._12_4_ = auVar89._12_4_ * fVar155;
      auVar88 = vfmadd231ps_fma(auVar215,(undefined1  [16])aVar6,auVar88);
      auVar18 = vfmadd231ps_fma(auVar88,(undefined1  [16])aVar5,auVar161);
      auVar89 = vsubps_avx512vl(local_4d0,(undefined1  [16])aVar4);
      uVar143 = auVar89._0_4_;
      auVar162._4_4_ = uVar143;
      auVar162._0_4_ = uVar143;
      auVar162._8_4_ = uVar143;
      auVar162._12_4_ = uVar143;
      auVar88 = vshufps_avx(auVar89,auVar89,0x55);
      auVar89 = vshufps_avx(auVar89,auVar89,0xaa);
      auVar216._0_4_ = auVar89._0_4_ * fVar165;
      auVar216._4_4_ = auVar89._4_4_ * fVar153;
      auVar216._8_4_ = auVar89._8_4_ * fVar154;
      auVar216._12_4_ = auVar89._12_4_ * fVar155;
      auVar88 = vfmadd231ps_fma(auVar216,(undefined1  [16])aVar6,auVar88);
      auVar19 = vfmadd231ps_fma(auVar88,(undefined1  [16])aVar5,auVar162);
      local_3e0 = ZEXT1632((undefined1  [16])aVar4);
      auVar89 = vsubps_avx512vl(_local_4e0,(undefined1  [16])aVar4);
      uVar143 = auVar89._0_4_;
      auVar163._4_4_ = uVar143;
      auVar163._0_4_ = uVar143;
      auVar163._8_4_ = uVar143;
      auVar163._12_4_ = uVar143;
      auVar88 = vshufps_avx(auVar89,auVar89,0x55);
      auVar89 = vshufps_avx(auVar89,auVar89,0xaa);
      auVar218._0_4_ = auVar89._0_4_ * fVar165;
      auVar218._4_4_ = auVar89._4_4_ * fVar153;
      auVar218._8_4_ = auVar89._8_4_ * fVar154;
      auVar218._12_4_ = auVar89._12_4_ * fVar155;
      auVar88 = vfmadd231ps_fma(auVar218,(undefined1  [16])aVar6,auVar88);
      auVar86 = vfmadd231ps_fma(auVar88,(undefined1  [16])aVar5,auVar163);
      auVar108 = *(undefined1 (*) [32])(bspline_basis0 + lVar27);
      uVar143 = auVar85._0_4_;
      local_2e0._4_4_ = uVar143;
      local_2e0._0_4_ = uVar143;
      local_2e0._8_4_ = uVar143;
      local_2e0._12_4_ = uVar143;
      local_2e0._16_4_ = uVar143;
      local_2e0._20_4_ = uVar143;
      local_2e0._24_4_ = uVar143;
      local_2e0._28_4_ = uVar143;
      auVar94._8_4_ = 1;
      auVar94._0_8_ = 0x100000001;
      auVar94._12_4_ = 1;
      auVar94._16_4_ = 1;
      auVar94._20_4_ = 1;
      auVar94._24_4_ = 1;
      auVar94._28_4_ = 1;
      local_300 = vpermps_avx2(auVar94,ZEXT1632(auVar85));
      auVar109 = *(undefined1 (*) [32])(bspline_basis0 + lVar27 + 0x484);
      uVar143 = auVar18._0_4_;
      auVar180._4_4_ = uVar143;
      auVar180._0_4_ = uVar143;
      auVar180._8_4_ = uVar143;
      auVar180._12_4_ = uVar143;
      local_320._16_4_ = uVar143;
      local_320._0_16_ = auVar180;
      local_320._20_4_ = uVar143;
      local_320._24_4_ = uVar143;
      local_320._28_4_ = uVar143;
      auVar107 = *(undefined1 (*) [32])(bspline_basis0 + lVar27 + 0x908);
      local_340 = vpermps_avx512vl(auVar94,ZEXT1632(auVar18));
      local_360 = vbroadcastss_avx512vl(auVar19);
      local_380 = vpermps_avx512vl(auVar94,ZEXT1632(auVar19));
      auVar106 = *(undefined1 (*) [32])(bspline_basis0 + lVar27 + 0xd8c);
      uVar143 = auVar86._0_4_;
      local_3a0._4_4_ = uVar143;
      local_3a0._0_4_ = uVar143;
      fStack_398 = (float)uVar143;
      fStack_394 = (float)uVar143;
      fStack_390 = (float)uVar143;
      fStack_38c = (float)uVar143;
      fStack_388 = (float)uVar143;
      register0x0000139c = uVar143;
      _local_3c0 = vpermps_avx512vl(auVar94,ZEXT1632(auVar86));
      auVar94 = vmulps_avx512vl(_local_3a0,auVar106);
      auVar95 = vmulps_avx512vl(_local_3c0,auVar106);
      auVar94 = vfmadd231ps_avx512vl(auVar94,auVar107,local_360);
      auVar95 = vfmadd231ps_avx512vl(auVar95,auVar107,local_380);
      auVar88 = vfmadd231ps_fma(auVar94,auVar109,local_320);
      auVar96 = vfmadd231ps_avx512vl(auVar95,auVar109,local_340);
      auVar97 = vfmadd231ps_avx512vl(ZEXT1632(auVar88),auVar108,local_2e0);
      auVar201 = ZEXT3264(auVar97);
      auVar94 = *(undefined1 (*) [32])(bspline_basis1 + lVar27);
      auVar95 = *(undefined1 (*) [32])(bspline_basis1 + lVar27 + 0x484);
      auVar98 = vfmadd231ps_avx512vl(auVar96,auVar108,local_300);
      auVar198 = ZEXT3264(auVar98);
      auVar96 = *(undefined1 (*) [32])(bspline_basis1 + lVar27 + 0x908);
      auVar105 = *(undefined1 (*) [32])(bspline_basis1 + lVar27 + 0xd8c);
      auVar99 = vmulps_avx512vl(_local_3a0,auVar105);
      auVar100 = vmulps_avx512vl(_local_3c0,auVar105);
      auVar99 = vfmadd231ps_avx512vl(auVar99,auVar96,local_360);
      auVar100 = vfmadd231ps_avx512vl(auVar100,auVar96,local_380);
      auVar99 = vfmadd231ps_avx512vl(auVar99,auVar95,local_320);
      auVar100 = vfmadd231ps_avx512vl(auVar100,auVar95,local_340);
      auVar20 = vfmadd231ps_fma(auVar99,auVar94,local_2e0);
      auVar207 = ZEXT1664(auVar20);
      auVar21 = vfmadd231ps_fma(auVar100,auVar94,local_300);
      auVar100 = vsubps_avx512vl(ZEXT1632(auVar20),auVar97);
      auVar101 = vsubps_avx512vl(ZEXT1632(auVar21),auVar98);
      auVar99 = vmulps_avx512vl(auVar98,auVar100);
      auVar102 = vmulps_avx512vl(auVar97,auVar101);
      auVar99 = vsubps_avx512vl(auVar99,auVar102);
      auVar88 = vshufps_avx(local_4b0,local_4b0,0xff);
      uVar156 = auVar88._0_8_;
      local_80._8_8_ = uVar156;
      local_80._0_8_ = uVar156;
      local_80._16_8_ = uVar156;
      local_80._24_8_ = uVar156;
      auVar88 = vshufps_avx(local_4c0,local_4c0,0xff);
      local_a0 = vbroadcastsd_avx512vl(auVar88);
      auVar88 = vshufps_avx512vl(local_4d0,local_4d0,0xff);
      local_c0 = vbroadcastsd_avx512vl(auVar88);
      auVar88 = vshufps_avx512vl(_local_4e0,_local_4e0,0xff);
      uVar156 = auVar88._0_8_;
      local_e0._8_8_ = uVar156;
      local_e0._0_8_ = uVar156;
      local_e0._16_8_ = uVar156;
      local_e0._24_8_ = uVar156;
      auVar102 = vmulps_avx512vl(local_e0,auVar106);
      auVar102 = vfmadd231ps_avx512vl(auVar102,auVar107,local_c0);
      auVar102 = vfmadd231ps_avx512vl(auVar102,auVar109,local_a0);
      auVar102 = vfmadd231ps_avx512vl(auVar102,auVar108,local_80);
      auVar103 = vmulps_avx512vl(local_e0,auVar105);
      auVar103 = vfmadd231ps_avx512vl(auVar103,auVar96,local_c0);
      auVar103 = vfmadd231ps_avx512vl(auVar103,auVar95,local_a0);
      auVar87 = vfmadd231ps_fma(auVar103,auVar94,local_80);
      auVar103 = vmulps_avx512vl(auVar101,auVar101);
      auVar103 = vfmadd231ps_avx512vl(auVar103,auVar100,auVar100);
      auVar104 = vmaxps_avx512vl(auVar102,ZEXT1632(auVar87));
      auVar104 = vmulps_avx512vl(auVar104,auVar104);
      auVar103 = vmulps_avx512vl(auVar104,auVar103);
      auVar99 = vmulps_avx512vl(auVar99,auVar99);
      uVar156 = vcmpps_avx512vl(auVar99,auVar103,2);
      auVar29 = local_4b0;
      auVar88 = vblendps_avx(auVar85,local_4b0,8);
      auVar221 = auVar222._0_16_;
      auVar89 = vandps_avx512vl(auVar88,auVar221);
      auVar28 = local_4c0;
      auVar88 = vblendps_avx(auVar18,local_4c0,8);
      auVar88 = vandps_avx512vl(auVar88,auVar221);
      auVar89 = vmaxps_avx(auVar89,auVar88);
      auVar23 = local_4d0;
      auVar88 = vblendps_avx(auVar19,local_4d0,8);
      auVar84 = vandps_avx512vl(auVar88,auVar221);
      auVar22 = _local_4e0;
      auVar88 = vblendps_avx(auVar86,_local_4e0,8);
      auVar88 = vandps_avx512vl(auVar88,auVar221);
      auVar88 = vmaxps_avx(auVar84,auVar88);
      auVar88 = vmaxps_avx(auVar89,auVar88);
      auVar89 = vmovshdup_avx(auVar88);
      auVar89 = vmaxss_avx(auVar89,auVar88);
      auVar88 = vshufpd_avx(auVar88,auVar88,1);
      auVar88 = vmaxss_avx(auVar88,auVar89);
      auVar89 = vcvtsi2ss_avx512f(auVar221,iVar8);
      local_460._0_16_ = auVar89;
      auVar104._0_4_ = auVar89._0_4_;
      auVar104._4_4_ = auVar104._0_4_;
      auVar104._8_4_ = auVar104._0_4_;
      auVar104._12_4_ = auVar104._0_4_;
      auVar104._16_4_ = auVar104._0_4_;
      auVar104._20_4_ = auVar104._0_4_;
      auVar104._24_4_ = auVar104._0_4_;
      auVar104._28_4_ = auVar104._0_4_;
      uVar24 = vcmpps_avx512vl(auVar104,_DAT_01faff40,0xe);
      bVar80 = (byte)uVar156 & (byte)uVar24;
      auVar88 = vmulss_avx512f(auVar88,SUB6416(ZEXT464(0x35000000),0));
      local_440._0_16_ = auVar88;
      auVar99 = local_440;
      auVar103._8_4_ = 2;
      auVar103._0_8_ = 0x200000002;
      auVar103._12_4_ = 2;
      auVar103._16_4_ = 2;
      auVar103._20_4_ = 2;
      auVar103._24_4_ = 2;
      auVar103._28_4_ = 2;
      local_120 = vpermps_avx2(auVar103,ZEXT1632(auVar85));
      local_140 = vpermps_avx2(auVar103,ZEXT1632(auVar18));
      local_160 = vpermps_avx2(auVar103,ZEXT1632(auVar19));
      local_180 = vpermps_avx2(auVar103,ZEXT1632(auVar86));
      _local_4e0 = auVar22;
      local_4d0 = auVar23;
      local_4c0 = auVar28;
      local_4b0 = auVar29;
      local_440 = auVar99;
      if (bVar80 != 0) {
        auVar105 = vmulps_avx512vl(local_180,auVar105);
        auVar96 = vfmadd213ps_avx512vl(auVar96,local_160,auVar105);
        auVar95 = vfmadd213ps_avx512vl(auVar95,local_140,auVar96);
        auVar105 = vfmadd213ps_avx512vl(auVar94,local_120,auVar95);
        auVar106 = vmulps_avx512vl(local_180,auVar106);
        auVar107 = vfmadd213ps_avx512vl(auVar107,local_160,auVar106);
        auVar95 = vfmadd213ps_avx512vl(auVar109,local_140,auVar107);
        auVar109 = *(undefined1 (*) [32])(bspline_basis0 + lVar27 + 0x1210);
        auVar107 = *(undefined1 (*) [32])(bspline_basis0 + lVar27 + 0x1694);
        auVar106 = *(undefined1 (*) [32])(bspline_basis0 + lVar27 + 0x1b18);
        auVar94 = *(undefined1 (*) [32])(bspline_basis0 + lVar27 + 0x1f9c);
        auVar99 = vfmadd213ps_avx512vl(auVar108,local_120,auVar95);
        auVar108 = vmulps_avx512vl(_local_3a0,auVar94);
        auVar95 = vmulps_avx512vl(_local_3c0,auVar94);
        auVar94 = vmulps_avx512vl(local_180,auVar94);
        auVar108 = vfmadd231ps_avx512vl(auVar108,auVar106,local_360);
        auVar95 = vfmadd231ps_avx512vl(auVar95,auVar106,local_380);
        auVar106 = vfmadd231ps_avx512vl(auVar94,local_160,auVar106);
        auVar108 = vfmadd231ps_avx512vl(auVar108,auVar107,local_320);
        auVar94 = vfmadd231ps_avx512vl(auVar95,auVar107,local_340);
        auVar95 = vfmadd231ps_avx512vl(auVar106,local_140,auVar107);
        auVar89 = vfmadd231ps_fma(auVar108,auVar109,local_2e0);
        auVar94 = vfmadd231ps_avx512vl(auVar94,auVar109,local_300);
        auVar108 = *(undefined1 (*) [32])(bspline_basis1 + lVar27 + 0x1210);
        auVar107 = *(undefined1 (*) [32])(bspline_basis1 + lVar27 + 0x1b18);
        auVar106 = *(undefined1 (*) [32])(bspline_basis1 + lVar27 + 0x1f9c);
        auVar95 = vfmadd231ps_avx512vl(auVar95,local_120,auVar109);
        auVar109 = vmulps_avx512vl(_local_3a0,auVar106);
        auVar96 = vmulps_avx512vl(_local_3c0,auVar106);
        auVar106 = vmulps_avx512vl(local_180,auVar106);
        auVar103 = vfmadd231ps_avx512vl(auVar109,auVar107,local_360);
        auVar96 = vfmadd231ps_avx512vl(auVar96,auVar107,local_380);
        auVar107 = vfmadd231ps_avx512vl(auVar106,local_160,auVar107);
        auVar222 = ZEXT1664(auVar221);
        auVar109 = *(undefined1 (*) [32])(bspline_basis1 + lVar27 + 0x1694);
        auVar106 = vfmadd231ps_avx512vl(auVar103,auVar109,local_320);
        auVar96 = vfmadd231ps_avx512vl(auVar96,auVar109,local_340);
        auVar109 = vfmadd231ps_avx512vl(auVar107,local_140,auVar109);
        auVar223 = ZEXT1664(auVar223._0_16_);
        auVar85 = vfmadd231ps_fma(auVar106,auVar108,local_2e0);
        auVar107 = vfmadd231ps_avx512vl(auVar96,auVar108,local_300);
        auVar106 = vfmadd231ps_avx512vl(auVar109,local_120,auVar108);
        auVar219._8_4_ = 0x7fffffff;
        auVar219._0_8_ = 0x7fffffff7fffffff;
        auVar219._12_4_ = 0x7fffffff;
        auVar219._16_4_ = 0x7fffffff;
        auVar219._20_4_ = 0x7fffffff;
        auVar219._24_4_ = 0x7fffffff;
        auVar219._28_4_ = 0x7fffffff;
        auVar108 = vandps_avx(ZEXT1632(auVar89),auVar219);
        auVar109 = vandps_avx(auVar94,auVar219);
        auVar109 = vmaxps_avx(auVar108,auVar109);
        auVar108 = vandps_avx(auVar95,auVar219);
        auVar108 = vmaxps_avx(auVar109,auVar108);
        local_440._0_4_ = auVar88._0_4_;
        auVar212._4_4_ = local_440._0_4_;
        auVar212._0_4_ = local_440._0_4_;
        auVar212._8_4_ = local_440._0_4_;
        auVar212._12_4_ = local_440._0_4_;
        auVar212._16_4_ = local_440._0_4_;
        auVar212._20_4_ = local_440._0_4_;
        auVar212._24_4_ = local_440._0_4_;
        auVar212._28_4_ = local_440._0_4_;
        uVar71 = vcmpps_avx512vl(auVar108,auVar212,1);
        bVar12 = (bool)((byte)uVar71 & 1);
        auVar110._0_4_ = (float)((uint)bVar12 * auVar100._0_4_ | (uint)!bVar12 * auVar89._0_4_);
        bVar12 = (bool)((byte)(uVar71 >> 1) & 1);
        auVar110._4_4_ = (float)((uint)bVar12 * auVar100._4_4_ | (uint)!bVar12 * auVar89._4_4_);
        bVar12 = (bool)((byte)(uVar71 >> 2) & 1);
        auVar110._8_4_ = (float)((uint)bVar12 * auVar100._8_4_ | (uint)!bVar12 * auVar89._8_4_);
        bVar12 = (bool)((byte)(uVar71 >> 3) & 1);
        auVar110._12_4_ = (float)((uint)bVar12 * auVar100._12_4_ | (uint)!bVar12 * auVar89._12_4_);
        fVar165 = (float)((uint)((byte)(uVar71 >> 4) & 1) * auVar100._16_4_);
        auVar110._16_4_ = fVar165;
        fVar154 = (float)((uint)((byte)(uVar71 >> 5) & 1) * auVar100._20_4_);
        auVar110._20_4_ = fVar154;
        fVar153 = (float)((uint)((byte)(uVar71 >> 6) & 1) * auVar100._24_4_);
        auVar110._24_4_ = fVar153;
        auVar110._28_4_ = (uint)(byte)(uVar71 >> 7) * auVar100._28_4_;
        bVar12 = (bool)((byte)uVar71 & 1);
        auVar111._0_4_ = (float)((uint)bVar12 * auVar101._0_4_ | (uint)!bVar12 * auVar94._0_4_);
        bVar12 = (bool)((byte)(uVar71 >> 1) & 1);
        auVar111._4_4_ = (float)((uint)bVar12 * auVar101._4_4_ | (uint)!bVar12 * auVar94._4_4_);
        bVar12 = (bool)((byte)(uVar71 >> 2) & 1);
        auVar111._8_4_ = (float)((uint)bVar12 * auVar101._8_4_ | (uint)!bVar12 * auVar94._8_4_);
        bVar12 = (bool)((byte)(uVar71 >> 3) & 1);
        auVar111._12_4_ = (float)((uint)bVar12 * auVar101._12_4_ | (uint)!bVar12 * auVar94._12_4_);
        bVar12 = (bool)((byte)(uVar71 >> 4) & 1);
        auVar111._16_4_ = (float)((uint)bVar12 * auVar101._16_4_ | (uint)!bVar12 * auVar94._16_4_);
        bVar12 = (bool)((byte)(uVar71 >> 5) & 1);
        auVar111._20_4_ = (float)((uint)bVar12 * auVar101._20_4_ | (uint)!bVar12 * auVar94._20_4_);
        bVar12 = (bool)((byte)(uVar71 >> 6) & 1);
        auVar111._24_4_ = (float)((uint)bVar12 * auVar101._24_4_ | (uint)!bVar12 * auVar94._24_4_);
        bVar12 = SUB81(uVar71 >> 7,0);
        auVar111._28_4_ = (uint)bVar12 * auVar101._28_4_ | (uint)!bVar12 * auVar94._28_4_;
        auVar108 = vandps_avx(auVar219,ZEXT1632(auVar85));
        auVar109 = vandps_avx(auVar107,auVar219);
        auVar109 = vmaxps_avx(auVar108,auVar109);
        auVar108 = vandps_avx(auVar106,auVar219);
        auVar108 = vmaxps_avx(auVar109,auVar108);
        uVar71 = vcmpps_avx512vl(auVar108,auVar212,1);
        bVar12 = (bool)((byte)uVar71 & 1);
        auVar112._0_4_ = (float)((uint)bVar12 * auVar100._0_4_ | (uint)!bVar12 * auVar85._0_4_);
        bVar12 = (bool)((byte)(uVar71 >> 1) & 1);
        auVar112._4_4_ = (float)((uint)bVar12 * auVar100._4_4_ | (uint)!bVar12 * auVar85._4_4_);
        bVar12 = (bool)((byte)(uVar71 >> 2) & 1);
        auVar112._8_4_ = (float)((uint)bVar12 * auVar100._8_4_ | (uint)!bVar12 * auVar85._8_4_);
        bVar12 = (bool)((byte)(uVar71 >> 3) & 1);
        auVar112._12_4_ = (float)((uint)bVar12 * auVar100._12_4_ | (uint)!bVar12 * auVar85._12_4_);
        fVar179 = (float)((uint)((byte)(uVar71 >> 4) & 1) * auVar100._16_4_);
        auVar112._16_4_ = fVar179;
        fVar155 = (float)((uint)((byte)(uVar71 >> 5) & 1) * auVar100._20_4_);
        auVar112._20_4_ = fVar155;
        fVar210 = (float)((uint)((byte)(uVar71 >> 6) & 1) * auVar100._24_4_);
        auVar112._24_4_ = fVar210;
        uVar72 = (uint)(byte)(uVar71 >> 7) * auVar100._28_4_;
        auVar112._28_4_ = uVar72;
        bVar12 = (bool)((byte)uVar71 & 1);
        auVar113._0_4_ = (float)((uint)bVar12 * auVar101._0_4_ | (uint)!bVar12 * auVar107._0_4_);
        bVar12 = (bool)((byte)(uVar71 >> 1) & 1);
        auVar113._4_4_ = (float)((uint)bVar12 * auVar101._4_4_ | (uint)!bVar12 * auVar107._4_4_);
        bVar12 = (bool)((byte)(uVar71 >> 2) & 1);
        auVar113._8_4_ = (float)((uint)bVar12 * auVar101._8_4_ | (uint)!bVar12 * auVar107._8_4_);
        bVar12 = (bool)((byte)(uVar71 >> 3) & 1);
        auVar113._12_4_ = (float)((uint)bVar12 * auVar101._12_4_ | (uint)!bVar12 * auVar107._12_4_);
        bVar12 = (bool)((byte)(uVar71 >> 4) & 1);
        auVar113._16_4_ = (float)((uint)bVar12 * auVar101._16_4_ | (uint)!bVar12 * auVar107._16_4_);
        bVar12 = (bool)((byte)(uVar71 >> 5) & 1);
        auVar113._20_4_ = (float)((uint)bVar12 * auVar101._20_4_ | (uint)!bVar12 * auVar107._20_4_);
        bVar12 = (bool)((byte)(uVar71 >> 6) & 1);
        auVar113._24_4_ = (float)((uint)bVar12 * auVar101._24_4_ | (uint)!bVar12 * auVar107._24_4_);
        bVar12 = SUB81(uVar71 >> 7,0);
        auVar113._28_4_ = (uint)bVar12 * auVar101._28_4_ | (uint)!bVar12 * auVar107._28_4_;
        auVar93 = vxorps_avx512vl(auVar180,auVar180);
        auVar108 = vfmadd213ps_avx512vl(auVar110,auVar110,ZEXT1632(auVar93));
        auVar88 = vfmadd231ps_fma(auVar108,auVar111,auVar111);
        auVar109 = vrsqrt14ps_avx512vl(ZEXT1632(auVar88));
        fVar82 = auVar109._0_4_;
        fVar83 = auVar109._4_4_;
        fVar134 = auVar109._8_4_;
        fVar135 = auVar109._12_4_;
        fVar136 = auVar109._16_4_;
        fVar137 = auVar109._20_4_;
        fVar139 = auVar109._24_4_;
        auVar108._4_4_ = fVar83 * fVar83 * fVar83 * auVar88._4_4_ * -0.5;
        auVar108._0_4_ = fVar82 * fVar82 * fVar82 * auVar88._0_4_ * -0.5;
        auVar108._8_4_ = fVar134 * fVar134 * fVar134 * auVar88._8_4_ * -0.5;
        auVar108._12_4_ = fVar135 * fVar135 * fVar135 * auVar88._12_4_ * -0.5;
        auVar108._16_4_ = fVar136 * fVar136 * fVar136 * -0.0;
        auVar108._20_4_ = fVar137 * fVar137 * fVar137 * -0.0;
        auVar108._24_4_ = fVar139 * fVar139 * fVar139 * -0.0;
        auVar108._28_4_ = auVar106._28_4_;
        auVar94 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar108 = vfmadd231ps_avx512vl(auVar108,auVar94,auVar109);
        auVar109._4_4_ = auVar111._4_4_ * auVar108._4_4_;
        auVar109._0_4_ = auVar111._0_4_ * auVar108._0_4_;
        auVar109._8_4_ = auVar111._8_4_ * auVar108._8_4_;
        auVar109._12_4_ = auVar111._12_4_ * auVar108._12_4_;
        auVar109._16_4_ = auVar111._16_4_ * auVar108._16_4_;
        auVar109._20_4_ = auVar111._20_4_ * auVar108._20_4_;
        auVar109._24_4_ = auVar111._24_4_ * auVar108._24_4_;
        auVar109._28_4_ = 0;
        auVar107._4_4_ = auVar108._4_4_ * -auVar110._4_4_;
        auVar107._0_4_ = auVar108._0_4_ * -auVar110._0_4_;
        auVar107._8_4_ = auVar108._8_4_ * -auVar110._8_4_;
        auVar107._12_4_ = auVar108._12_4_ * -auVar110._12_4_;
        auVar107._16_4_ = auVar108._16_4_ * -fVar165;
        auVar107._20_4_ = auVar108._20_4_ * -fVar154;
        auVar107._24_4_ = auVar108._24_4_ * -fVar153;
        auVar107._28_4_ = auVar111._28_4_;
        auVar108 = vmulps_avx512vl(auVar108,ZEXT1632(auVar93));
        auVar101 = ZEXT1632(auVar93);
        auVar106 = vfmadd213ps_avx512vl(auVar112,auVar112,auVar101);
        auVar88 = vfmadd231ps_fma(auVar106,auVar113,auVar113);
        auVar96 = vrsqrt14ps_avx512vl(ZEXT1632(auVar88));
        fVar165 = auVar96._0_4_;
        fVar153 = auVar96._4_4_;
        fVar154 = auVar96._8_4_;
        fVar82 = auVar96._12_4_;
        fVar83 = auVar96._16_4_;
        fVar134 = auVar96._20_4_;
        fVar135 = auVar96._24_4_;
        auVar106._4_4_ = fVar153 * fVar153 * fVar153 * auVar88._4_4_ * -0.5;
        auVar106._0_4_ = fVar165 * fVar165 * fVar165 * auVar88._0_4_ * -0.5;
        auVar106._8_4_ = fVar154 * fVar154 * fVar154 * auVar88._8_4_ * -0.5;
        auVar106._12_4_ = fVar82 * fVar82 * fVar82 * auVar88._12_4_ * -0.5;
        auVar106._16_4_ = fVar83 * fVar83 * fVar83 * -0.0;
        auVar106._20_4_ = fVar134 * fVar134 * fVar134 * -0.0;
        auVar106._24_4_ = fVar135 * fVar135 * fVar135 * -0.0;
        auVar106._28_4_ = 0;
        auVar106 = vfmadd231ps_avx512vl(auVar106,auVar94,auVar96);
        auVar95._4_4_ = auVar113._4_4_ * auVar106._4_4_;
        auVar95._0_4_ = auVar113._0_4_ * auVar106._0_4_;
        auVar95._8_4_ = auVar113._8_4_ * auVar106._8_4_;
        auVar95._12_4_ = auVar113._12_4_ * auVar106._12_4_;
        auVar95._16_4_ = auVar113._16_4_ * auVar106._16_4_;
        auVar95._20_4_ = auVar113._20_4_ * auVar106._20_4_;
        auVar95._24_4_ = auVar113._24_4_ * auVar106._24_4_;
        auVar95._28_4_ = auVar96._28_4_;
        auVar96._4_4_ = -auVar112._4_4_ * auVar106._4_4_;
        auVar96._0_4_ = -auVar112._0_4_ * auVar106._0_4_;
        auVar96._8_4_ = -auVar112._8_4_ * auVar106._8_4_;
        auVar96._12_4_ = -auVar112._12_4_ * auVar106._12_4_;
        auVar96._16_4_ = -fVar179 * auVar106._16_4_;
        auVar96._20_4_ = -fVar155 * auVar106._20_4_;
        auVar96._24_4_ = -fVar210 * auVar106._24_4_;
        auVar96._28_4_ = uVar72 ^ 0x80000000;
        auVar106 = vmulps_avx512vl(auVar106,auVar101);
        auVar88 = vfmadd213ps_fma(auVar109,auVar102,auVar97);
        auVar89 = vfmadd213ps_fma(auVar107,auVar102,auVar98);
        auVar94 = vfmadd213ps_avx512vl(auVar108,auVar102,auVar99);
        auVar100 = vfmadd213ps_avx512vl(auVar95,ZEXT1632(auVar87),ZEXT1632(auVar20));
        auVar84 = vfnmadd213ps_fma(auVar109,auVar102,auVar97);
        auVar97 = ZEXT1632(auVar87);
        auVar85 = vfmadd213ps_fma(auVar96,auVar97,ZEXT1632(auVar21));
        auVar221 = vfnmadd213ps_fma(auVar107,auVar102,auVar98);
        auVar18 = vfmadd213ps_fma(auVar106,auVar97,auVar105);
        auVar109 = vfnmadd231ps_avx512vl(auVar99,auVar102,auVar108);
        auVar20 = vfnmadd213ps_fma(auVar95,auVar97,ZEXT1632(auVar20));
        auVar21 = vfnmadd213ps_fma(auVar96,auVar97,ZEXT1632(auVar21));
        auVar30 = vfnmadd231ps_fma(auVar105,ZEXT1632(auVar87),auVar106);
        auVar107 = vsubps_avx512vl(auVar100,ZEXT1632(auVar84));
        auVar108 = vsubps_avx(ZEXT1632(auVar85),ZEXT1632(auVar221));
        auVar106 = vsubps_avx512vl(ZEXT1632(auVar18),auVar109);
        auVar95 = vmulps_avx512vl(auVar108,auVar109);
        auVar19 = vfmsub231ps_fma(auVar95,ZEXT1632(auVar221),auVar106);
        auVar105._4_4_ = auVar84._4_4_ * auVar106._4_4_;
        auVar105._0_4_ = auVar84._0_4_ * auVar106._0_4_;
        auVar105._8_4_ = auVar84._8_4_ * auVar106._8_4_;
        auVar105._12_4_ = auVar84._12_4_ * auVar106._12_4_;
        auVar105._16_4_ = auVar106._16_4_ * 0.0;
        auVar105._20_4_ = auVar106._20_4_ * 0.0;
        auVar105._24_4_ = auVar106._24_4_ * 0.0;
        auVar105._28_4_ = auVar106._28_4_;
        auVar106 = vfmsub231ps_avx512vl(auVar105,auVar109,auVar107);
        auVar99._4_4_ = auVar221._4_4_ * auVar107._4_4_;
        auVar99._0_4_ = auVar221._0_4_ * auVar107._0_4_;
        auVar99._8_4_ = auVar221._8_4_ * auVar107._8_4_;
        auVar99._12_4_ = auVar221._12_4_ * auVar107._12_4_;
        auVar99._16_4_ = auVar107._16_4_ * 0.0;
        auVar99._20_4_ = auVar107._20_4_ * 0.0;
        auVar99._24_4_ = auVar107._24_4_ * 0.0;
        auVar99._28_4_ = auVar107._28_4_;
        auVar86 = vfmsub231ps_fma(auVar99,ZEXT1632(auVar84),auVar108);
        auVar108 = vfmadd231ps_avx512vl(ZEXT1632(auVar86),auVar101,auVar106);
        auVar108 = vfmadd231ps_avx512vl(auVar108,auVar101,ZEXT1632(auVar19));
        auVar103 = ZEXT1632(auVar93);
        uVar71 = vcmpps_avx512vl(auVar108,auVar103,2);
        bVar70 = (byte)uVar71;
        fVar82 = (float)((uint)(bVar70 & 1) * auVar88._0_4_ |
                        (uint)!(bool)(bVar70 & 1) * auVar20._0_4_);
        bVar12 = (bool)((byte)(uVar71 >> 1) & 1);
        fVar134 = (float)((uint)bVar12 * auVar88._4_4_ | (uint)!bVar12 * auVar20._4_4_);
        bVar12 = (bool)((byte)(uVar71 >> 2) & 1);
        fVar136 = (float)((uint)bVar12 * auVar88._8_4_ | (uint)!bVar12 * auVar20._8_4_);
        bVar12 = (bool)((byte)(uVar71 >> 3) & 1);
        fVar139 = (float)((uint)bVar12 * auVar88._12_4_ | (uint)!bVar12 * auVar20._12_4_);
        auVar96 = ZEXT1632(CONCAT412(fVar139,CONCAT48(fVar136,CONCAT44(fVar134,fVar82))));
        fVar83 = (float)((uint)(bVar70 & 1) * auVar89._0_4_ |
                        (uint)!(bool)(bVar70 & 1) * auVar21._0_4_);
        bVar12 = (bool)((byte)(uVar71 >> 1) & 1);
        fVar135 = (float)((uint)bVar12 * auVar89._4_4_ | (uint)!bVar12 * auVar21._4_4_);
        bVar12 = (bool)((byte)(uVar71 >> 2) & 1);
        fVar137 = (float)((uint)bVar12 * auVar89._8_4_ | (uint)!bVar12 * auVar21._8_4_);
        bVar12 = (bool)((byte)(uVar71 >> 3) & 1);
        fVar140 = (float)((uint)bVar12 * auVar89._12_4_ | (uint)!bVar12 * auVar21._12_4_);
        auVar105 = ZEXT1632(CONCAT412(fVar140,CONCAT48(fVar137,CONCAT44(fVar135,fVar83))));
        auVar101._0_4_ =
             (float)((uint)(bVar70 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar70 & 1) * auVar30._0_4_)
        ;
        bVar12 = (bool)((byte)(uVar71 >> 1) & 1);
        auVar101._4_4_ = (float)((uint)bVar12 * auVar94._4_4_ | (uint)!bVar12 * auVar30._4_4_);
        bVar12 = (bool)((byte)(uVar71 >> 2) & 1);
        auVar101._8_4_ = (float)((uint)bVar12 * auVar94._8_4_ | (uint)!bVar12 * auVar30._8_4_);
        bVar12 = (bool)((byte)(uVar71 >> 3) & 1);
        auVar101._12_4_ = (float)((uint)bVar12 * auVar94._12_4_ | (uint)!bVar12 * auVar30._12_4_);
        fVar154 = (float)((uint)((byte)(uVar71 >> 4) & 1) * auVar94._16_4_);
        auVar101._16_4_ = fVar154;
        fVar165 = (float)((uint)((byte)(uVar71 >> 5) & 1) * auVar94._20_4_);
        auVar101._20_4_ = fVar165;
        fVar153 = (float)((uint)((byte)(uVar71 >> 6) & 1) * auVar94._24_4_);
        auVar101._24_4_ = fVar153;
        iVar1 = (uint)(byte)(uVar71 >> 7) * auVar94._28_4_;
        auVar101._28_4_ = iVar1;
        auVar107 = vblendmps_avx512vl(ZEXT1632(auVar84),auVar100);
        auVar114._0_4_ =
             (uint)(bVar70 & 1) * auVar107._0_4_ | (uint)!(bool)(bVar70 & 1) * auVar19._0_4_;
        bVar12 = (bool)((byte)(uVar71 >> 1) & 1);
        auVar114._4_4_ = (uint)bVar12 * auVar107._4_4_ | (uint)!bVar12 * auVar19._4_4_;
        bVar12 = (bool)((byte)(uVar71 >> 2) & 1);
        auVar114._8_4_ = (uint)bVar12 * auVar107._8_4_ | (uint)!bVar12 * auVar19._8_4_;
        bVar12 = (bool)((byte)(uVar71 >> 3) & 1);
        auVar114._12_4_ = (uint)bVar12 * auVar107._12_4_ | (uint)!bVar12 * auVar19._12_4_;
        auVar114._16_4_ = (uint)((byte)(uVar71 >> 4) & 1) * auVar107._16_4_;
        auVar114._20_4_ = (uint)((byte)(uVar71 >> 5) & 1) * auVar107._20_4_;
        auVar114._24_4_ = (uint)((byte)(uVar71 >> 6) & 1) * auVar107._24_4_;
        auVar114._28_4_ = (uint)(byte)(uVar71 >> 7) * auVar107._28_4_;
        auVar107 = vblendmps_avx512vl(ZEXT1632(auVar221),ZEXT1632(auVar85));
        auVar115._0_4_ =
             (float)((uint)(bVar70 & 1) * auVar107._0_4_ | (uint)!(bool)(bVar70 & 1) * auVar89._0_4_
                    );
        bVar12 = (bool)((byte)(uVar71 >> 1) & 1);
        auVar115._4_4_ = (float)((uint)bVar12 * auVar107._4_4_ | (uint)!bVar12 * auVar89._4_4_);
        bVar12 = (bool)((byte)(uVar71 >> 2) & 1);
        auVar115._8_4_ = (float)((uint)bVar12 * auVar107._8_4_ | (uint)!bVar12 * auVar89._8_4_);
        bVar12 = (bool)((byte)(uVar71 >> 3) & 1);
        auVar115._12_4_ = (float)((uint)bVar12 * auVar107._12_4_ | (uint)!bVar12 * auVar89._12_4_);
        fVar179 = (float)((uint)((byte)(uVar71 >> 4) & 1) * auVar107._16_4_);
        auVar115._16_4_ = fVar179;
        fVar210 = (float)((uint)((byte)(uVar71 >> 5) & 1) * auVar107._20_4_);
        auVar115._20_4_ = fVar210;
        fVar155 = (float)((uint)((byte)(uVar71 >> 6) & 1) * auVar107._24_4_);
        auVar115._24_4_ = fVar155;
        auVar115._28_4_ = (uint)(byte)(uVar71 >> 7) * auVar107._28_4_;
        auVar107 = vblendmps_avx512vl(auVar109,ZEXT1632(auVar18));
        auVar116._0_4_ =
             (float)((uint)(bVar70 & 1) * auVar107._0_4_ | (uint)!(bool)(bVar70 & 1) * auVar94._0_4_
                    );
        bVar12 = (bool)((byte)(uVar71 >> 1) & 1);
        auVar116._4_4_ = (float)((uint)bVar12 * auVar107._4_4_ | (uint)!bVar12 * auVar94._4_4_);
        bVar12 = (bool)((byte)(uVar71 >> 2) & 1);
        auVar116._8_4_ = (float)((uint)bVar12 * auVar107._8_4_ | (uint)!bVar12 * auVar94._8_4_);
        bVar12 = (bool)((byte)(uVar71 >> 3) & 1);
        auVar116._12_4_ = (float)((uint)bVar12 * auVar107._12_4_ | (uint)!bVar12 * auVar94._12_4_);
        bVar12 = (bool)((byte)(uVar71 >> 4) & 1);
        auVar116._16_4_ = (float)((uint)bVar12 * auVar107._16_4_ | (uint)!bVar12 * auVar94._16_4_);
        bVar12 = (bool)((byte)(uVar71 >> 5) & 1);
        auVar116._20_4_ = (float)((uint)bVar12 * auVar107._20_4_ | (uint)!bVar12 * auVar94._20_4_);
        bVar12 = (bool)((byte)(uVar71 >> 6) & 1);
        auVar116._24_4_ = (float)((uint)bVar12 * auVar107._24_4_ | (uint)!bVar12 * auVar94._24_4_);
        bVar12 = SUB81(uVar71 >> 7,0);
        auVar116._28_4_ = (uint)bVar12 * auVar107._28_4_ | (uint)!bVar12 * auVar94._28_4_;
        auVar117._0_4_ =
             (uint)(bVar70 & 1) * (int)auVar84._0_4_ | (uint)!(bool)(bVar70 & 1) * auVar100._0_4_;
        bVar12 = (bool)((byte)(uVar71 >> 1) & 1);
        auVar117._4_4_ = (uint)bVar12 * (int)auVar84._4_4_ | (uint)!bVar12 * auVar100._4_4_;
        bVar12 = (bool)((byte)(uVar71 >> 2) & 1);
        auVar117._8_4_ = (uint)bVar12 * (int)auVar84._8_4_ | (uint)!bVar12 * auVar100._8_4_;
        bVar12 = (bool)((byte)(uVar71 >> 3) & 1);
        auVar117._12_4_ = (uint)bVar12 * (int)auVar84._12_4_ | (uint)!bVar12 * auVar100._12_4_;
        auVar117._16_4_ = (uint)!(bool)((byte)(uVar71 >> 4) & 1) * auVar100._16_4_;
        auVar117._20_4_ = (uint)!(bool)((byte)(uVar71 >> 5) & 1) * auVar100._20_4_;
        auVar117._24_4_ = (uint)!(bool)((byte)(uVar71 >> 6) & 1) * auVar100._24_4_;
        auVar117._28_4_ = (uint)!SUB81(uVar71 >> 7,0) * auVar100._28_4_;
        bVar12 = (bool)((byte)(uVar71 >> 1) & 1);
        bVar14 = (bool)((byte)(uVar71 >> 2) & 1);
        bVar15 = (bool)((byte)(uVar71 >> 3) & 1);
        auVar118._0_4_ =
             (uint)(bVar70 & 1) * auVar109._0_4_ | (uint)!(bool)(bVar70 & 1) * auVar18._0_4_;
        bVar13 = (bool)((byte)(uVar71 >> 1) & 1);
        auVar118._4_4_ = (uint)bVar13 * auVar109._4_4_ | (uint)!bVar13 * auVar18._4_4_;
        bVar13 = (bool)((byte)(uVar71 >> 2) & 1);
        auVar118._8_4_ = (uint)bVar13 * auVar109._8_4_ | (uint)!bVar13 * auVar18._8_4_;
        bVar13 = (bool)((byte)(uVar71 >> 3) & 1);
        auVar118._12_4_ = (uint)bVar13 * auVar109._12_4_ | (uint)!bVar13 * auVar18._12_4_;
        auVar118._16_4_ = (uint)((byte)(uVar71 >> 4) & 1) * auVar109._16_4_;
        auVar118._20_4_ = (uint)((byte)(uVar71 >> 5) & 1) * auVar109._20_4_;
        auVar118._24_4_ = (uint)((byte)(uVar71 >> 6) & 1) * auVar109._24_4_;
        iVar2 = (uint)(byte)(uVar71 >> 7) * auVar109._28_4_;
        auVar118._28_4_ = iVar2;
        auVar99 = vsubps_avx512vl(auVar117,auVar96);
        auVar109 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar15 * (int)auVar221._12_4_ |
                                                 (uint)!bVar15 * auVar85._12_4_,
                                                 CONCAT48((uint)bVar14 * (int)auVar221._8_4_ |
                                                          (uint)!bVar14 * auVar85._8_4_,
                                                          CONCAT44((uint)bVar12 *
                                                                   (int)auVar221._4_4_ |
                                                                   (uint)!bVar12 * auVar85._4_4_,
                                                                   (uint)(bVar70 & 1) *
                                                                   (int)auVar221._0_4_ |
                                                                   (uint)!(bool)(bVar70 & 1) *
                                                                   auVar85._0_4_)))),auVar105);
        auVar201 = ZEXT3264(auVar109);
        auVar107 = vsubps_avx(auVar118,auVar101);
        auVar106 = vsubps_avx(auVar96,auVar114);
        auVar207 = ZEXT3264(auVar106);
        auVar94 = vsubps_avx(auVar105,auVar115);
        auVar95 = vsubps_avx(auVar101,auVar116);
        auVar97._4_4_ = auVar107._4_4_ * fVar134;
        auVar97._0_4_ = auVar107._0_4_ * fVar82;
        auVar97._8_4_ = auVar107._8_4_ * fVar136;
        auVar97._12_4_ = auVar107._12_4_ * fVar139;
        auVar97._16_4_ = auVar107._16_4_ * 0.0;
        auVar97._20_4_ = auVar107._20_4_ * 0.0;
        auVar97._24_4_ = auVar107._24_4_ * 0.0;
        auVar97._28_4_ = iVar2;
        auVar88 = vfmsub231ps_fma(auVar97,auVar101,auVar99);
        auVar98._4_4_ = fVar135 * auVar99._4_4_;
        auVar98._0_4_ = fVar83 * auVar99._0_4_;
        auVar98._8_4_ = fVar137 * auVar99._8_4_;
        auVar98._12_4_ = fVar140 * auVar99._12_4_;
        auVar98._16_4_ = auVar99._16_4_ * 0.0;
        auVar98._20_4_ = auVar99._20_4_ * 0.0;
        auVar98._24_4_ = auVar99._24_4_ * 0.0;
        auVar98._28_4_ = auVar108._28_4_;
        auVar89 = vfmsub231ps_fma(auVar98,auVar96,auVar109);
        auVar108 = vfmadd231ps_avx512vl(ZEXT1632(auVar89),auVar103,ZEXT1632(auVar88));
        auVar194._0_4_ = auVar109._0_4_ * auVar101._0_4_;
        auVar194._4_4_ = auVar109._4_4_ * auVar101._4_4_;
        auVar194._8_4_ = auVar109._8_4_ * auVar101._8_4_;
        auVar194._12_4_ = auVar109._12_4_ * auVar101._12_4_;
        auVar194._16_4_ = auVar109._16_4_ * fVar154;
        auVar194._20_4_ = auVar109._20_4_ * fVar165;
        auVar194._24_4_ = auVar109._24_4_ * fVar153;
        auVar194._28_4_ = 0;
        auVar88 = vfmsub231ps_fma(auVar194,auVar105,auVar107);
        auVar97 = vfmadd231ps_avx512vl(auVar108,auVar103,ZEXT1632(auVar88));
        auVar108 = vmulps_avx512vl(auVar95,auVar114);
        auVar108 = vfmsub231ps_avx512vl(auVar108,auVar106,auVar116);
        auVar100._4_4_ = auVar94._4_4_ * auVar116._4_4_;
        auVar100._0_4_ = auVar94._0_4_ * auVar116._0_4_;
        auVar100._8_4_ = auVar94._8_4_ * auVar116._8_4_;
        auVar100._12_4_ = auVar94._12_4_ * auVar116._12_4_;
        auVar100._16_4_ = auVar94._16_4_ * auVar116._16_4_;
        auVar100._20_4_ = auVar94._20_4_ * auVar116._20_4_;
        auVar100._24_4_ = auVar94._24_4_ * auVar116._24_4_;
        auVar100._28_4_ = auVar116._28_4_;
        auVar88 = vfmsub231ps_fma(auVar100,auVar115,auVar95);
        auVar195._0_4_ = auVar115._0_4_ * auVar106._0_4_;
        auVar195._4_4_ = auVar115._4_4_ * auVar106._4_4_;
        auVar195._8_4_ = auVar115._8_4_ * auVar106._8_4_;
        auVar195._12_4_ = auVar115._12_4_ * auVar106._12_4_;
        auVar195._16_4_ = fVar179 * auVar106._16_4_;
        auVar195._20_4_ = fVar210 * auVar106._20_4_;
        auVar195._24_4_ = fVar155 * auVar106._24_4_;
        auVar195._28_4_ = 0;
        auVar89 = vfmsub231ps_fma(auVar195,auVar94,auVar114);
        auVar108 = vfmadd231ps_avx512vl(ZEXT1632(auVar89),auVar103,auVar108);
        auVar98 = vfmadd231ps_avx512vl(auVar108,auVar103,ZEXT1632(auVar88));
        auVar198 = ZEXT3264(auVar98);
        auVar108 = vmaxps_avx(auVar97,auVar98);
        uVar156 = vcmpps_avx512vl(auVar108,auVar103,2);
        bVar80 = bVar80 & (byte)uVar156;
        if (bVar80 != 0) {
          auVar45._4_4_ = auVar95._4_4_ * auVar109._4_4_;
          auVar45._0_4_ = auVar95._0_4_ * auVar109._0_4_;
          auVar45._8_4_ = auVar95._8_4_ * auVar109._8_4_;
          auVar45._12_4_ = auVar95._12_4_ * auVar109._12_4_;
          auVar45._16_4_ = auVar95._16_4_ * auVar109._16_4_;
          auVar45._20_4_ = auVar95._20_4_ * auVar109._20_4_;
          auVar45._24_4_ = auVar95._24_4_ * auVar109._24_4_;
          auVar45._28_4_ = auVar108._28_4_;
          auVar18 = vfmsub231ps_fma(auVar45,auVar94,auVar107);
          auVar46._4_4_ = auVar107._4_4_ * auVar106._4_4_;
          auVar46._0_4_ = auVar107._0_4_ * auVar106._0_4_;
          auVar46._8_4_ = auVar107._8_4_ * auVar106._8_4_;
          auVar46._12_4_ = auVar107._12_4_ * auVar106._12_4_;
          auVar46._16_4_ = auVar107._16_4_ * auVar106._16_4_;
          auVar46._20_4_ = auVar107._20_4_ * auVar106._20_4_;
          auVar46._24_4_ = auVar107._24_4_ * auVar106._24_4_;
          auVar46._28_4_ = auVar107._28_4_;
          auVar85 = vfmsub231ps_fma(auVar46,auVar99,auVar95);
          auVar47._4_4_ = auVar94._4_4_ * auVar99._4_4_;
          auVar47._0_4_ = auVar94._0_4_ * auVar99._0_4_;
          auVar47._8_4_ = auVar94._8_4_ * auVar99._8_4_;
          auVar47._12_4_ = auVar94._12_4_ * auVar99._12_4_;
          auVar47._16_4_ = auVar94._16_4_ * auVar99._16_4_;
          auVar47._20_4_ = auVar94._20_4_ * auVar99._20_4_;
          auVar47._24_4_ = auVar94._24_4_ * auVar99._24_4_;
          auVar47._28_4_ = auVar94._28_4_;
          auVar19 = vfmsub231ps_fma(auVar47,auVar106,auVar109);
          auVar88 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar85),ZEXT1632(auVar19));
          auVar89 = vfmadd231ps_fma(ZEXT1632(auVar88),ZEXT1632(auVar18),ZEXT1232(ZEXT412(0)) << 0x20
                                   );
          auVar108 = vrcp14ps_avx512vl(ZEXT1632(auVar89));
          auVar36._8_4_ = 0x3f800000;
          auVar36._0_8_ = 0x3f8000003f800000;
          auVar36._12_4_ = 0x3f800000;
          auVar36._16_4_ = 0x3f800000;
          auVar36._20_4_ = 0x3f800000;
          auVar36._24_4_ = 0x3f800000;
          auVar36._28_4_ = 0x3f800000;
          auVar109 = vfnmadd213ps_avx512vl(auVar108,ZEXT1632(auVar89),auVar36);
          auVar88 = vfmadd132ps_fma(auVar109,auVar108,auVar108);
          auVar201 = ZEXT1664(auVar88);
          auVar48._4_4_ = auVar19._4_4_ * auVar101._4_4_;
          auVar48._0_4_ = auVar19._0_4_ * auVar101._0_4_;
          auVar48._8_4_ = auVar19._8_4_ * auVar101._8_4_;
          auVar48._12_4_ = auVar19._12_4_ * auVar101._12_4_;
          auVar48._16_4_ = fVar154 * 0.0;
          auVar48._20_4_ = fVar165 * 0.0;
          auVar48._24_4_ = fVar153 * 0.0;
          auVar48._28_4_ = iVar1;
          auVar85 = vfmadd231ps_fma(auVar48,auVar105,ZEXT1632(auVar85));
          auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar96,ZEXT1632(auVar18));
          fVar153 = auVar88._0_4_;
          fVar154 = auVar88._4_4_;
          fVar155 = auVar88._8_4_;
          fVar210 = auVar88._12_4_;
          local_280._28_4_ = auVar108._28_4_;
          local_280._0_28_ =
               ZEXT1628(CONCAT412(auVar85._12_4_ * fVar210,
                                  CONCAT48(auVar85._8_4_ * fVar155,
                                           CONCAT44(auVar85._4_4_ * fVar154,auVar85._0_4_ * fVar153)
                                          )));
          auVar207 = ZEXT3264(local_280);
          auVar146._8_4_ = 3;
          auVar146._0_8_ = 0x300000003;
          auVar146._12_4_ = 3;
          auVar146._16_4_ = 3;
          auVar146._20_4_ = 3;
          auVar146._24_4_ = 3;
          auVar146._28_4_ = 3;
          auVar108 = vpermps_avx2(auVar146,ZEXT1632((undefined1  [16])aVar4));
          uVar156 = vcmpps_avx512vl(auVar108,local_280,2);
          fVar165 = (ray->super_RayK<1>).tfar;
          auVar37._4_4_ = fVar165;
          auVar37._0_4_ = fVar165;
          auVar37._8_4_ = fVar165;
          auVar37._12_4_ = fVar165;
          auVar37._16_4_ = fVar165;
          auVar37._20_4_ = fVar165;
          auVar37._24_4_ = fVar165;
          auVar37._28_4_ = fVar165;
          uVar24 = vcmpps_avx512vl(local_280,auVar37,2);
          bVar80 = (byte)uVar156 & (byte)uVar24 & bVar80;
          if (bVar80 != 0) {
            uVar81 = vcmpps_avx512vl(ZEXT1632(auVar89),ZEXT1232(ZEXT412(0)) << 0x20,4);
            uVar81 = bVar80 & uVar81;
            if ((char)uVar81 != '\0') {
              fVar165 = auVar97._0_4_ * fVar153;
              fVar179 = auVar97._4_4_ * fVar154;
              auVar49._4_4_ = fVar179;
              auVar49._0_4_ = fVar165;
              fVar82 = auVar97._8_4_ * fVar155;
              auVar49._8_4_ = fVar82;
              fVar83 = auVar97._12_4_ * fVar210;
              auVar49._12_4_ = fVar83;
              fVar134 = auVar97._16_4_ * 0.0;
              auVar49._16_4_ = fVar134;
              fVar135 = auVar97._20_4_ * 0.0;
              auVar49._20_4_ = fVar135;
              fVar136 = auVar97._24_4_ * 0.0;
              auVar49._24_4_ = fVar136;
              auVar49._28_4_ = auVar97._28_4_;
              auVar147._8_4_ = 0x3f800000;
              auVar147._0_8_ = 0x3f8000003f800000;
              auVar147._12_4_ = 0x3f800000;
              auVar147._16_4_ = 0x3f800000;
              auVar147._20_4_ = 0x3f800000;
              auVar147._24_4_ = 0x3f800000;
              auVar147._28_4_ = 0x3f800000;
              auVar108 = vsubps_avx(auVar147,auVar49);
              local_2c0._0_4_ =
                   (float)((uint)(bVar70 & 1) * (int)fVar165 |
                          (uint)!(bool)(bVar70 & 1) * auVar108._0_4_);
              bVar12 = (bool)((byte)(uVar71 >> 1) & 1);
              local_2c0._4_4_ =
                   (float)((uint)bVar12 * (int)fVar179 | (uint)!bVar12 * auVar108._4_4_);
              bVar12 = (bool)((byte)(uVar71 >> 2) & 1);
              local_2c0._8_4_ = (float)((uint)bVar12 * (int)fVar82 | (uint)!bVar12 * auVar108._8_4_)
              ;
              bVar12 = (bool)((byte)(uVar71 >> 3) & 1);
              local_2c0._12_4_ =
                   (float)((uint)bVar12 * (int)fVar83 | (uint)!bVar12 * auVar108._12_4_);
              bVar12 = (bool)((byte)(uVar71 >> 4) & 1);
              local_2c0._16_4_ =
                   (float)((uint)bVar12 * (int)fVar134 | (uint)!bVar12 * auVar108._16_4_);
              bVar12 = (bool)((byte)(uVar71 >> 5) & 1);
              local_2c0._20_4_ =
                   (float)((uint)bVar12 * (int)fVar135 | (uint)!bVar12 * auVar108._20_4_);
              bVar12 = (bool)((byte)(uVar71 >> 6) & 1);
              local_2c0._24_4_ =
                   (float)((uint)bVar12 * (int)fVar136 | (uint)!bVar12 * auVar108._24_4_);
              bVar12 = SUB81(uVar71 >> 7,0);
              local_2c0._28_4_ =
                   (float)((uint)bVar12 * auVar97._28_4_ | (uint)!bVar12 * auVar108._28_4_);
              auVar108 = vsubps_avx(ZEXT1632(auVar87),auVar102);
              auVar88 = vfmadd213ps_fma(auVar108,local_2c0,auVar102);
              fVar165 = local_518->depth_scale;
              auVar102._4_4_ = fVar165;
              auVar102._0_4_ = fVar165;
              auVar102._8_4_ = fVar165;
              auVar102._12_4_ = fVar165;
              auVar102._16_4_ = fVar165;
              auVar102._20_4_ = fVar165;
              auVar102._24_4_ = fVar165;
              auVar102._28_4_ = fVar165;
              auVar108 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar88._12_4_ + auVar88._12_4_,
                                                            CONCAT48(auVar88._8_4_ + auVar88._8_4_,
                                                                     CONCAT44(auVar88._4_4_ +
                                                                              auVar88._4_4_,
                                                                              auVar88._0_4_ +
                                                                              auVar88._0_4_)))),
                                         auVar102);
              uVar25 = vcmpps_avx512vl(local_280,auVar108,6);
              uVar81 = uVar81 & uVar25;
              bVar80 = (byte)uVar81;
              if (bVar80 != 0) {
                auVar177._0_4_ = auVar98._0_4_ * fVar153;
                auVar177._4_4_ = auVar98._4_4_ * fVar154;
                auVar177._8_4_ = auVar98._8_4_ * fVar155;
                auVar177._12_4_ = auVar98._12_4_ * fVar210;
                auVar177._16_4_ = auVar98._16_4_ * 0.0;
                auVar177._20_4_ = auVar98._20_4_ * 0.0;
                auVar177._24_4_ = auVar98._24_4_ * 0.0;
                auVar177._28_4_ = 0;
                auVar181._8_4_ = 0x3f800000;
                auVar181._0_8_ = 0x3f8000003f800000;
                auVar181._12_4_ = 0x3f800000;
                auVar181._16_4_ = 0x3f800000;
                auVar181._20_4_ = 0x3f800000;
                auVar181._24_4_ = 0x3f800000;
                auVar181._28_4_ = 0x3f800000;
                auVar108 = vsubps_avx(auVar181,auVar177);
                auVar119._0_4_ =
                     (uint)(bVar70 & 1) * (int)auVar177._0_4_ |
                     (uint)!(bool)(bVar70 & 1) * auVar108._0_4_;
                bVar12 = (bool)((byte)(uVar71 >> 1) & 1);
                auVar119._4_4_ = (uint)bVar12 * (int)auVar177._4_4_ | (uint)!bVar12 * auVar108._4_4_
                ;
                bVar12 = (bool)((byte)(uVar71 >> 2) & 1);
                auVar119._8_4_ = (uint)bVar12 * (int)auVar177._8_4_ | (uint)!bVar12 * auVar108._8_4_
                ;
                bVar12 = (bool)((byte)(uVar71 >> 3) & 1);
                auVar119._12_4_ =
                     (uint)bVar12 * (int)auVar177._12_4_ | (uint)!bVar12 * auVar108._12_4_;
                bVar12 = (bool)((byte)(uVar71 >> 4) & 1);
                auVar119._16_4_ =
                     (uint)bVar12 * (int)auVar177._16_4_ | (uint)!bVar12 * auVar108._16_4_;
                bVar12 = (bool)((byte)(uVar71 >> 5) & 1);
                auVar119._20_4_ =
                     (uint)bVar12 * (int)auVar177._20_4_ | (uint)!bVar12 * auVar108._20_4_;
                bVar12 = (bool)((byte)(uVar71 >> 6) & 1);
                auVar119._24_4_ =
                     (uint)bVar12 * (int)auVar177._24_4_ | (uint)!bVar12 * auVar108._24_4_;
                auVar119._28_4_ = (uint)!SUB81(uVar71 >> 7,0) * auVar108._28_4_;
                auVar38._8_4_ = 0x40000000;
                auVar38._0_8_ = 0x4000000040000000;
                auVar38._12_4_ = 0x40000000;
                auVar38._16_4_ = 0x40000000;
                auVar38._20_4_ = 0x40000000;
                auVar38._24_4_ = 0x40000000;
                auVar38._28_4_ = 0x40000000;
                local_2a0 = vfmsub132ps_avx512vl(auVar119,auVar181,auVar38);
                local_260 = 0;
                local_25c = iVar8;
                local_250 = local_4b0._0_8_;
                uStack_248 = local_4b0._8_8_;
                local_240 = local_4c0._0_8_;
                uStack_238 = local_4c0._8_8_;
                local_230 = local_4d0._0_8_;
                uStack_228 = local_4d0._8_8_;
                local_220 = local_4e0;
                uStack_218 = uStack_4d8;
                if ((pGVar74->mask & (ray->super_RayK<1>).mask) != 0) {
                  fVar165 = 1.0 / auVar104._0_4_;
                  local_200[0] = fVar165 * (local_2c0._0_4_ + 0.0);
                  local_200[1] = fVar165 * (local_2c0._4_4_ + 1.0);
                  local_200[2] = fVar165 * (local_2c0._8_4_ + 2.0);
                  local_200[3] = fVar165 * (local_2c0._12_4_ + 3.0);
                  fStack_1f0 = fVar165 * (local_2c0._16_4_ + 4.0);
                  fStack_1ec = fVar165 * (local_2c0._20_4_ + 5.0);
                  fStack_1e8 = fVar165 * (local_2c0._24_4_ + 6.0);
                  fStack_1e4 = local_2c0._28_4_ + 7.0;
                  local_1e0 = local_2a0;
                  local_1c0 = local_280;
                  auVar148._8_4_ = 0x7f800000;
                  auVar148._0_8_ = 0x7f8000007f800000;
                  auVar148._12_4_ = 0x7f800000;
                  auVar148._16_4_ = 0x7f800000;
                  auVar148._20_4_ = 0x7f800000;
                  auVar148._24_4_ = 0x7f800000;
                  auVar148._28_4_ = 0x7f800000;
                  auVar108 = vblendmps_avx512vl(auVar148,local_280);
                  auVar120._0_4_ =
                       (uint)(bVar80 & 1) * auVar108._0_4_ | (uint)!(bool)(bVar80 & 1) * 0x7f800000;
                  bVar12 = (bool)((byte)(uVar81 >> 1) & 1);
                  auVar120._4_4_ = (uint)bVar12 * auVar108._4_4_ | (uint)!bVar12 * 0x7f800000;
                  bVar12 = (bool)((byte)(uVar81 >> 2) & 1);
                  auVar120._8_4_ = (uint)bVar12 * auVar108._8_4_ | (uint)!bVar12 * 0x7f800000;
                  bVar12 = (bool)((byte)(uVar81 >> 3) & 1);
                  auVar120._12_4_ = (uint)bVar12 * auVar108._12_4_ | (uint)!bVar12 * 0x7f800000;
                  bVar12 = (bool)((byte)(uVar81 >> 4) & 1);
                  auVar120._16_4_ = (uint)bVar12 * auVar108._16_4_ | (uint)!bVar12 * 0x7f800000;
                  bVar12 = (bool)((byte)(uVar81 >> 5) & 1);
                  auVar120._20_4_ = (uint)bVar12 * auVar108._20_4_ | (uint)!bVar12 * 0x7f800000;
                  bVar12 = (bool)((byte)(uVar81 >> 6) & 1);
                  auVar120._24_4_ = (uint)bVar12 * auVar108._24_4_ | (uint)!bVar12 * 0x7f800000;
                  bVar12 = SUB81(uVar81 >> 7,0);
                  auVar120._28_4_ = (uint)bVar12 * auVar108._28_4_ | (uint)!bVar12 * 0x7f800000;
                  auVar108 = vshufps_avx(auVar120,auVar120,0xb1);
                  auVar108 = vminps_avx(auVar120,auVar108);
                  auVar109 = vshufpd_avx(auVar108,auVar108,5);
                  auVar108 = vminps_avx(auVar108,auVar109);
                  auVar109 = vpermpd_avx2(auVar108,0x4e);
                  auVar108 = vminps_avx(auVar108,auVar109);
                  uVar156 = vcmpps_avx512vl(auVar120,auVar108,0);
                  uVar72 = (uint)uVar81;
                  if (((byte)uVar156 & bVar80) != 0) {
                    uVar72 = (uint)((byte)uVar156 & bVar80);
                  }
                  uVar26 = 0;
                  for (; (uVar72 & 1) == 0; uVar72 = uVar72 >> 1 | 0x80000000) {
                    uVar26 = uVar26 + 1;
                  }
                  uVar71 = (ulong)uVar26;
                  if ((local_538->args->filter != (RTCFilterFunctionN)0x0) ||
                     (pGVar74->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                    local_400 = ZEXT432((uint)(ray->super_RayK<1>).tfar);
                    local_420 = local_280;
                    pRVar75 = local_538;
                    do {
                      local_494 = local_200[uVar71];
                      local_490 = *(undefined4 *)(local_1e0 + uVar71 * 4);
                      (ray->super_RayK<1>).tfar = *(float *)(local_1c0 + uVar71 * 4);
                      local_510.context = pRVar75->user;
                      fVar165 = 1.0 - local_494;
                      auVar35._8_4_ = 0x80000000;
                      auVar35._0_8_ = 0x8000000080000000;
                      auVar35._12_4_ = 0x80000000;
                      auVar85 = vxorps_avx512vl(ZEXT416((uint)fVar165),auVar35);
                      auVar88 = ZEXT416((uint)(local_494 * fVar165 * 4.0));
                      auVar89 = vfnmsub213ss_fma(ZEXT416((uint)local_494),ZEXT416((uint)local_494),
                                                 auVar88);
                      auVar88 = vfmadd213ss_fma(ZEXT416((uint)fVar165),ZEXT416((uint)fVar165),
                                                auVar88);
                      fVar165 = fVar165 * auVar85._0_4_ * 0.5;
                      fVar153 = auVar89._0_4_ * 0.5;
                      auVar201 = ZEXT464((uint)fVar153);
                      fVar154 = auVar88._0_4_ * 0.5;
                      fVar155 = local_494 * local_494 * 0.5;
                      auVar192._0_4_ = fVar155 * (float)local_4e0._0_4_;
                      auVar192._4_4_ = fVar155 * (float)local_4e0._4_4_;
                      auVar192._8_4_ = fVar155 * (float)uStack_4d8;
                      auVar192._12_4_ = fVar155 * uStack_4d8._4_4_;
                      auVar175._4_4_ = fVar154;
                      auVar175._0_4_ = fVar154;
                      auVar175._8_4_ = fVar154;
                      auVar175._12_4_ = fVar154;
                      auVar88 = vfmadd132ps_fma(auVar175,auVar192,local_4d0);
                      auVar193._4_4_ = fVar153;
                      auVar193._0_4_ = fVar153;
                      auVar193._8_4_ = fVar153;
                      auVar193._12_4_ = fVar153;
                      auVar88 = vfmadd132ps_fma(auVar193,auVar88,local_4c0);
                      auVar198 = ZEXT1664(auVar88);
                      auVar176._4_4_ = fVar165;
                      auVar176._0_4_ = fVar165;
                      auVar176._8_4_ = fVar165;
                      auVar176._12_4_ = fVar165;
                      auVar89 = vfmadd132ps_fma(auVar176,auVar88,local_4b0);
                      local_4a0 = vmovlps_avx(auVar89);
                      local_498 = vextractps_avx(auVar89,2);
                      local_48c = (int)local_528;
                      local_488 = (int)local_530;
                      local_484 = (local_510.context)->instID[0];
                      local_480 = (local_510.context)->instPrimID[0];
                      local_53c = -1;
                      local_510.valid = &local_53c;
                      local_510.geometryUserPtr = pGVar74->userPtr;
                      local_510.ray = (RTCRayN *)ray;
                      local_510.hit = (RTCHitN *)&local_4a0;
                      local_510.N = 1;
                      if (pGVar74->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01bb18b6:
                        p_Var11 = pRVar75->args->filter;
                        if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                           (((pRVar75->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar74->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar198 = ZEXT1664(auVar198._0_16_);
                          auVar201 = ZEXT1664(auVar201._0_16_);
                          (*p_Var11)(&local_510);
                          auVar207 = ZEXT3264(local_420);
                          auVar223 = ZEXT464(0xbf800000);
                          auVar88 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                          auVar222 = ZEXT1664(auVar88);
                          pRVar75 = local_538;
                          if (*local_510.valid == 0) goto LAB_01bb196a;
                        }
                        (((Vec3f *)((long)local_510.ray + 0x30))->field_0).components[0] =
                             *(float *)local_510.hit;
                        (((Vec3f *)((long)local_510.ray + 0x30))->field_0).field_0.y =
                             *(float *)(local_510.hit + 4);
                        (((Vec3f *)((long)local_510.ray + 0x30))->field_0).field_0.z =
                             *(float *)(local_510.hit + 8);
                        *(float *)((long)local_510.ray + 0x3c) = *(float *)(local_510.hit + 0xc);
                        *(float *)((long)local_510.ray + 0x40) = *(float *)(local_510.hit + 0x10);
                        *(float *)((long)local_510.ray + 0x44) = *(float *)(local_510.hit + 0x14);
                        *(float *)((long)local_510.ray + 0x48) = *(float *)(local_510.hit + 0x18);
                        *(float *)((long)local_510.ray + 0x4c) = *(float *)(local_510.hit + 0x1c);
                        *(float *)((long)local_510.ray + 0x50) = *(float *)(local_510.hit + 0x20);
                      }
                      else {
                        auVar198 = ZEXT1664(auVar88);
                        auVar201 = ZEXT464((uint)fVar153);
                        (*pGVar74->intersectionFilterN)(&local_510);
                        auVar207 = ZEXT3264(local_420);
                        auVar223 = ZEXT464(0xbf800000);
                        auVar88 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                        auVar222 = ZEXT1664(auVar88);
                        pRVar75 = local_538;
                        if (*local_510.valid != 0) goto LAB_01bb18b6;
LAB_01bb196a:
                        auVar223 = ZEXT464(0xbf800000);
                        (ray->super_RayK<1>).tfar = (float)local_400._0_4_;
                        pRVar75 = local_538;
                      }
                      bVar80 = ~(byte)(1 << ((uint)uVar71 & 0x1f)) & (byte)uVar81;
                      fVar165 = (ray->super_RayK<1>).tfar;
                      auVar44._4_4_ = fVar165;
                      auVar44._0_4_ = fVar165;
                      auVar44._8_4_ = fVar165;
                      auVar44._12_4_ = fVar165;
                      auVar44._16_4_ = fVar165;
                      auVar44._20_4_ = fVar165;
                      auVar44._24_4_ = fVar165;
                      auVar44._28_4_ = fVar165;
                      uVar156 = vcmpps_avx512vl(auVar207._0_32_,auVar44,2);
                      prim = local_520;
                      if ((bVar80 & (byte)uVar156) == 0) goto LAB_01bb0a9e;
                      local_400 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
                      bVar80 = bVar80 & (byte)uVar156;
                      uVar81 = (ulong)bVar80;
                      auVar152._8_4_ = 0x7f800000;
                      auVar152._0_8_ = 0x7f8000007f800000;
                      auVar152._12_4_ = 0x7f800000;
                      auVar152._16_4_ = 0x7f800000;
                      auVar152._20_4_ = 0x7f800000;
                      auVar152._24_4_ = 0x7f800000;
                      auVar152._28_4_ = 0x7f800000;
                      auVar108 = vblendmps_avx512vl(auVar152,auVar207._0_32_);
                      auVar133._0_4_ =
                           (uint)(bVar80 & 1) * auVar108._0_4_ |
                           (uint)!(bool)(bVar80 & 1) * 0x7f800000;
                      bVar12 = (bool)(bVar80 >> 1 & 1);
                      auVar133._4_4_ = (uint)bVar12 * auVar108._4_4_ | (uint)!bVar12 * 0x7f800000;
                      bVar12 = (bool)(bVar80 >> 2 & 1);
                      auVar133._8_4_ = (uint)bVar12 * auVar108._8_4_ | (uint)!bVar12 * 0x7f800000;
                      bVar12 = (bool)(bVar80 >> 3 & 1);
                      auVar133._12_4_ = (uint)bVar12 * auVar108._12_4_ | (uint)!bVar12 * 0x7f800000;
                      bVar12 = (bool)(bVar80 >> 4 & 1);
                      auVar133._16_4_ = (uint)bVar12 * auVar108._16_4_ | (uint)!bVar12 * 0x7f800000;
                      bVar12 = (bool)(bVar80 >> 5 & 1);
                      auVar133._20_4_ = (uint)bVar12 * auVar108._20_4_ | (uint)!bVar12 * 0x7f800000;
                      bVar12 = (bool)(bVar80 >> 6 & 1);
                      auVar133._24_4_ = (uint)bVar12 * auVar108._24_4_ | (uint)!bVar12 * 0x7f800000;
                      auVar133._28_4_ =
                           (uint)(bVar80 >> 7) * auVar108._28_4_ |
                           (uint)!(bool)(bVar80 >> 7) * 0x7f800000;
                      auVar108 = vshufps_avx(auVar133,auVar133,0xb1);
                      auVar108 = vminps_avx(auVar133,auVar108);
                      auVar109 = vshufpd_avx(auVar108,auVar108,5);
                      auVar108 = vminps_avx(auVar108,auVar109);
                      auVar109 = vpermpd_avx2(auVar108,0x4e);
                      auVar108 = vminps_avx(auVar108,auVar109);
                      uVar156 = vcmpps_avx512vl(auVar133,auVar108,0);
                      bVar70 = (byte)uVar156 & bVar80;
                      if (bVar70 != 0) {
                        bVar80 = bVar70;
                      }
                      uVar77 = 0;
                      for (uVar73 = (uint)bVar80; (uVar73 & 1) == 0;
                          uVar73 = uVar73 >> 1 | 0x80000000) {
                        uVar77 = uVar77 + 1;
                      }
                      uVar71 = (ulong)uVar77;
                    } while( true );
                  }
                  fVar165 = local_200[uVar71];
                  fVar153 = *(float *)(local_1e0 + uVar71 * 4);
                  fVar154 = 1.0 - fVar165;
                  auVar31._8_4_ = 0x80000000;
                  auVar31._0_8_ = 0x8000000080000000;
                  auVar31._12_4_ = 0x80000000;
                  auVar85 = vxorps_avx512vl(ZEXT416((uint)fVar154),auVar31);
                  auVar88 = ZEXT416((uint)(fVar165 * fVar154 * 4.0));
                  auVar89 = vfnmsub213ss_fma(ZEXT416((uint)fVar165),ZEXT416((uint)fVar165),auVar88);
                  auVar88 = vfmadd213ss_fma(ZEXT416((uint)fVar154),ZEXT416((uint)fVar154),auVar88);
                  fVar154 = fVar154 * auVar85._0_4_ * 0.5;
                  fVar155 = auVar89._0_4_ * 0.5;
                  auVar201 = ZEXT464((uint)fVar155);
                  fVar210 = auVar88._0_4_ * 0.5;
                  fVar179 = fVar165 * fVar165 * 0.5;
                  auVar186._0_4_ = fVar179 * (float)local_4e0._0_4_;
                  auVar186._4_4_ = fVar179 * (float)local_4e0._4_4_;
                  auVar186._8_4_ = fVar179 * (float)uStack_4d8;
                  auVar186._12_4_ = fVar179 * uStack_4d8._4_4_;
                  auVar169._4_4_ = fVar210;
                  auVar169._0_4_ = fVar210;
                  auVar169._8_4_ = fVar210;
                  auVar169._12_4_ = fVar210;
                  auVar88 = vfmadd132ps_fma(auVar169,auVar186,local_4d0);
                  auVar187._4_4_ = fVar155;
                  auVar187._0_4_ = fVar155;
                  auVar187._8_4_ = fVar155;
                  auVar187._12_4_ = fVar155;
                  auVar88 = vfmadd132ps_fma(auVar187,auVar88,local_4c0);
                  auVar198 = ZEXT1664(auVar88);
                  auVar170._4_4_ = fVar154;
                  auVar170._0_4_ = fVar154;
                  auVar170._8_4_ = fVar154;
                  auVar170._12_4_ = fVar154;
                  (ray->super_RayK<1>).tfar = *(float *)(local_1c0 + uVar71 * 4);
                  auVar88 = vfmadd132ps_fma(auVar170,auVar88,local_4b0);
                  uVar156 = vmovlps_avx(auVar88);
                  *(undefined8 *)&(ray->Ng).field_0 = uVar156;
                  fVar154 = (float)vextractps_avx(auVar88,2);
                  (ray->Ng).field_0.field_0.z = fVar154;
                  ray->u = fVar165;
                  ray->v = fVar153;
                  ray->primID = uVar73;
                  ray->geomID = uVar77;
                  ray->instID[0] = local_538->user->instID[0];
                  ray->instPrimID[0] = local_538->user->instPrimID[0];
                  prim = local_520;
                }
              }
            }
          }
        }
      }
LAB_01bb0a9e:
      context = local_538;
      if (8 < iVar8) {
        local_400 = vpbroadcastd_avx512vl();
        local_420._4_4_ = local_440._0_4_;
        local_420._0_4_ = local_440._0_4_;
        local_420._8_4_ = local_440._0_4_;
        local_420._12_4_ = local_440._0_4_;
        local_420._16_4_ = local_440._0_4_;
        local_420._20_4_ = local_440._0_4_;
        local_420._24_4_ = local_440._0_4_;
        local_420._28_4_ = local_440._0_4_;
        auVar149._8_4_ = 3;
        auVar149._0_8_ = 0x300000003;
        auVar149._12_4_ = 3;
        auVar149._16_4_ = 3;
        auVar149._20_4_ = 3;
        auVar149._24_4_ = 3;
        auVar149._28_4_ = 3;
        local_3e0 = vpermps_avx2(auVar149,local_3e0);
        local_100 = 1.0 / (float)local_460._0_4_;
        fStack_fc = local_100;
        fStack_f8 = local_100;
        fStack_f4 = local_100;
        fStack_f0 = local_100;
        fStack_ec = local_100;
        fStack_e8 = local_100;
        fStack_e4 = local_100;
        lVar76 = 8;
LAB_01bb0b3b:
        auVar108 = vpbroadcastd_avx512vl();
        auVar108 = vpor_avx2(auVar108,_DAT_01fe9900);
        uVar24 = vpcmpd_avx512vl(auVar108,local_400,1);
        auVar108 = *(undefined1 (*) [32])(bspline_basis0 + lVar76 * 4 + lVar27);
        auVar109 = *(undefined1 (*) [32])(lVar27 + 0x21aefac + lVar76 * 4);
        auVar107 = *(undefined1 (*) [32])(lVar27 + 0x21af430 + lVar76 * 4);
        auVar106 = *(undefined1 (*) [32])(lVar27 + 0x21af8b4 + lVar76 * 4);
        fVar165 = auVar106._0_4_;
        auVar202._0_4_ = fVar165 * (float)local_3a0._0_4_;
        fVar153 = auVar106._4_4_;
        auVar202._4_4_ = fVar153 * (float)local_3a0._4_4_;
        fVar154 = auVar106._8_4_;
        auVar202._8_4_ = fVar154 * fStack_398;
        fVar155 = auVar106._12_4_;
        auVar202._12_4_ = fVar155 * fStack_394;
        fVar210 = auVar106._16_4_;
        auVar202._16_4_ = fVar210 * fStack_390;
        fVar179 = auVar106._20_4_;
        auVar202._20_4_ = fVar179 * fStack_38c;
        auVar202._28_36_ = auVar201._28_36_;
        fVar82 = auVar106._24_4_;
        auVar202._24_4_ = fVar82 * fStack_388;
        auVar201._0_4_ = fVar165 * (float)local_3c0._0_4_;
        auVar201._4_4_ = fVar153 * (float)local_3c0._4_4_;
        auVar201._8_4_ = fVar154 * fStack_3b8;
        auVar201._12_4_ = fVar155 * fStack_3b4;
        auVar201._16_4_ = fVar210 * fStack_3b0;
        auVar201._20_4_ = fVar179 * fStack_3ac;
        auVar201._28_36_ = auVar198._28_36_;
        auVar201._24_4_ = fVar82 * fStack_3a8;
        auVar94 = vmulps_avx512vl(local_e0,auVar106);
        auVar95 = vfmadd231ps_avx512vl(auVar202._0_32_,auVar107,local_360);
        auVar96 = vfmadd231ps_avx512vl(auVar201._0_32_,auVar107,local_380);
        auVar94 = vfmadd231ps_avx512vl(auVar94,auVar107,local_c0);
        auVar95 = vfmadd231ps_avx512vl(auVar95,auVar109,local_320);
        auVar96 = vfmadd231ps_avx512vl(auVar96,auVar109,local_340);
        auVar105 = vfmadd231ps_avx512vl(auVar94,auVar109,local_a0);
        auVar88 = vfmadd231ps_fma(auVar95,auVar108,local_2e0);
        auVar201 = ZEXT1664(auVar88);
        auVar89 = vfmadd231ps_fma(auVar96,auVar108,local_300);
        auVar198 = ZEXT1664(auVar89);
        auVar94 = *(undefined1 (*) [32])(bspline_basis1 + lVar76 * 4 + lVar27);
        auVar95 = *(undefined1 (*) [32])(lVar27 + 0x21b13cc + lVar76 * 4);
        auVar97 = vfmadd231ps_avx512vl(auVar105,auVar108,local_80);
        auVar96 = *(undefined1 (*) [32])(lVar27 + 0x21b1850 + lVar76 * 4);
        auVar105 = *(undefined1 (*) [32])(lVar27 + 0x21b1cd4 + lVar76 * 4);
        fVar83 = auVar105._0_4_;
        auVar208._0_4_ = fVar83 * (float)local_3a0._0_4_;
        fVar134 = auVar105._4_4_;
        auVar208._4_4_ = fVar134 * (float)local_3a0._4_4_;
        fVar135 = auVar105._8_4_;
        auVar208._8_4_ = fVar135 * fStack_398;
        fVar136 = auVar105._12_4_;
        auVar208._12_4_ = fVar136 * fStack_394;
        fVar137 = auVar105._16_4_;
        auVar208._16_4_ = fVar137 * fStack_390;
        fVar139 = auVar105._20_4_;
        auVar208._20_4_ = fVar139 * fStack_38c;
        auVar208._28_36_ = auVar207._28_36_;
        fVar140 = auVar105._24_4_;
        auVar208._24_4_ = fVar140 * fStack_388;
        auVar50._4_4_ = fVar134 * (float)local_3c0._4_4_;
        auVar50._0_4_ = fVar83 * (float)local_3c0._0_4_;
        auVar50._8_4_ = fVar135 * fStack_3b8;
        auVar50._12_4_ = fVar136 * fStack_3b4;
        auVar50._16_4_ = fVar137 * fStack_3b0;
        auVar50._20_4_ = fVar139 * fStack_3ac;
        auVar50._24_4_ = fVar140 * fStack_3a8;
        auVar50._28_4_ = uStack_3a4;
        auVar99 = vmulps_avx512vl(local_e0,auVar105);
        auVar98 = vfmadd231ps_avx512vl(auVar208._0_32_,auVar96,local_360);
        auVar100 = vfmadd231ps_avx512vl(auVar50,auVar96,local_380);
        auVar99 = vfmadd231ps_avx512vl(auVar99,auVar96,local_c0);
        auVar98 = vfmadd231ps_avx512vl(auVar98,auVar95,local_320);
        auVar100 = vfmadd231ps_avx512vl(auVar100,auVar95,local_340);
        auVar99 = vfmadd231ps_avx512vl(auVar99,auVar95,local_a0);
        auVar85 = vfmadd231ps_fma(auVar98,auVar94,local_2e0);
        auVar207 = ZEXT1664(auVar85);
        auVar18 = vfmadd231ps_fma(auVar100,auVar94,local_300);
        auVar98 = vfmadd231ps_avx512vl(auVar99,auVar94,local_80);
        auVar100 = vmaxps_avx512vl(auVar97,auVar98);
        auVar99 = vsubps_avx(ZEXT1632(auVar85),ZEXT1632(auVar88));
        auVar101 = vsubps_avx512vl(ZEXT1632(auVar18),ZEXT1632(auVar89));
        auVar102 = vmulps_avx512vl(ZEXT1632(auVar89),auVar99);
        auVar103 = vmulps_avx512vl(ZEXT1632(auVar88),auVar101);
        auVar102 = vsubps_avx512vl(auVar102,auVar103);
        auVar103 = vmulps_avx512vl(auVar101,auVar101);
        auVar103 = vfmadd231ps_avx512vl(auVar103,auVar99,auVar99);
        auVar100 = vmulps_avx512vl(auVar100,auVar100);
        auVar100 = vmulps_avx512vl(auVar100,auVar103);
        auVar102 = vmulps_avx512vl(auVar102,auVar102);
        uVar156 = vcmpps_avx512vl(auVar102,auVar100,2);
        bVar80 = (byte)uVar24 & (byte)uVar156;
        if (bVar80 != 0) {
          fVar138 = local_180._0_4_;
          fVar141 = local_180._4_4_;
          auVar51._4_4_ = fVar141 * fVar134;
          auVar51._0_4_ = fVar138 * fVar83;
          fVar83 = local_180._8_4_;
          auVar51._8_4_ = fVar83 * fVar135;
          fVar134 = local_180._12_4_;
          auVar51._12_4_ = fVar134 * fVar136;
          fVar135 = local_180._16_4_;
          auVar51._16_4_ = fVar135 * fVar137;
          fVar136 = local_180._20_4_;
          auVar51._20_4_ = fVar136 * fVar139;
          fVar137 = local_180._24_4_;
          auVar51._24_4_ = fVar137 * fVar140;
          auVar51._28_4_ = auVar105._28_4_;
          auVar96 = vfmadd213ps_avx512vl(auVar96,local_160,auVar51);
          auVar95 = vfmadd213ps_avx512vl(auVar95,local_140,auVar96);
          auVar94 = vfmadd213ps_avx512vl(auVar94,local_120,auVar95);
          auVar52._4_4_ = fVar141 * fVar153;
          auVar52._0_4_ = fVar138 * fVar165;
          auVar52._8_4_ = fVar83 * fVar154;
          auVar52._12_4_ = fVar134 * fVar155;
          auVar52._16_4_ = fVar135 * fVar210;
          auVar52._20_4_ = fVar136 * fVar179;
          auVar52._24_4_ = fVar137 * fVar82;
          auVar52._28_4_ = auVar106._28_4_;
          auVar107 = vfmadd213ps_avx512vl(auVar107,local_160,auVar52);
          auVar109 = vfmadd213ps_avx512vl(auVar109,local_140,auVar107);
          auVar95 = vfmadd213ps_avx512vl(auVar108,local_120,auVar109);
          auVar108 = *(undefined1 (*) [32])(lVar27 + 0x21afd38 + lVar76 * 4);
          auVar109 = *(undefined1 (*) [32])(lVar27 + 0x21b01bc + lVar76 * 4);
          auVar107 = *(undefined1 (*) [32])(lVar27 + 0x21b0640 + lVar76 * 4);
          auVar106 = *(undefined1 (*) [32])(lVar27 + 0x21b0ac4 + lVar76 * 4);
          auVar96 = vmulps_avx512vl(_local_3a0,auVar106);
          auVar105 = vmulps_avx512vl(_local_3c0,auVar106);
          auVar53._4_4_ = fVar141 * auVar106._4_4_;
          auVar53._0_4_ = fVar138 * auVar106._0_4_;
          auVar53._8_4_ = fVar83 * auVar106._8_4_;
          auVar53._12_4_ = fVar134 * auVar106._12_4_;
          auVar53._16_4_ = fVar135 * auVar106._16_4_;
          auVar53._20_4_ = fVar136 * auVar106._20_4_;
          auVar53._24_4_ = fVar137 * auVar106._24_4_;
          auVar53._28_4_ = auVar106._28_4_;
          auVar106 = vfmadd231ps_avx512vl(auVar96,auVar107,local_360);
          auVar96 = vfmadd231ps_avx512vl(auVar105,auVar107,local_380);
          auVar107 = vfmadd231ps_avx512vl(auVar53,local_160,auVar107);
          auVar106 = vfmadd231ps_avx512vl(auVar106,auVar109,local_320);
          auVar96 = vfmadd231ps_avx512vl(auVar96,auVar109,local_340);
          auVar109 = vfmadd231ps_avx512vl(auVar107,local_140,auVar109);
          auVar106 = vfmadd231ps_avx512vl(auVar106,auVar108,local_2e0);
          auVar96 = vfmadd231ps_avx512vl(auVar96,auVar108,local_300);
          auVar105 = vfmadd231ps_avx512vl(auVar109,local_120,auVar108);
          auVar108 = *(undefined1 (*) [32])(lVar27 + 0x21b2158 + lVar76 * 4);
          auVar109 = *(undefined1 (*) [32])(lVar27 + 0x21b2a60 + lVar76 * 4);
          auVar107 = *(undefined1 (*) [32])(lVar27 + 0x21b2ee4 + lVar76 * 4);
          auVar100 = vmulps_avx512vl(_local_3a0,auVar107);
          auVar102 = vmulps_avx512vl(_local_3c0,auVar107);
          auVar107 = vmulps_avx512vl(local_180,auVar107);
          auVar100 = vfmadd231ps_avx512vl(auVar100,auVar109,local_360);
          auVar102 = vfmadd231ps_avx512vl(auVar102,auVar109,local_380);
          auVar107 = vfmadd231ps_avx512vl(auVar107,local_160,auVar109);
          auVar222 = ZEXT1664(auVar222._0_16_);
          auVar109 = *(undefined1 (*) [32])(lVar27 + 0x21b25dc + lVar76 * 4);
          auVar100 = vfmadd231ps_avx512vl(auVar100,auVar109,local_320);
          auVar102 = vfmadd231ps_avx512vl(auVar102,auVar109,local_340);
          auVar109 = vfmadd231ps_avx512vl(auVar107,local_140,auVar109);
          auVar223 = ZEXT1664(auVar223._0_16_);
          auVar107 = vfmadd231ps_avx512vl(auVar100,auVar108,local_2e0);
          auVar100 = vfmadd231ps_avx512vl(auVar102,auVar108,local_300);
          auVar109 = vfmadd231ps_avx512vl(auVar109,local_120,auVar108);
          auVar102 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar106,auVar102);
          vandps_avx512vl(auVar96,auVar102);
          auVar108 = vmaxps_avx(auVar102,auVar102);
          vandps_avx512vl(auVar105,auVar102);
          auVar108 = vmaxps_avx(auVar108,auVar102);
          uVar71 = vcmpps_avx512vl(auVar108,local_420,1);
          bVar12 = (bool)((byte)uVar71 & 1);
          auVar121._0_4_ = (float)((uint)bVar12 * auVar99._0_4_ | (uint)!bVar12 * auVar106._0_4_);
          bVar12 = (bool)((byte)(uVar71 >> 1) & 1);
          auVar121._4_4_ = (float)((uint)bVar12 * auVar99._4_4_ | (uint)!bVar12 * auVar106._4_4_);
          bVar12 = (bool)((byte)(uVar71 >> 2) & 1);
          auVar121._8_4_ = (float)((uint)bVar12 * auVar99._8_4_ | (uint)!bVar12 * auVar106._8_4_);
          bVar12 = (bool)((byte)(uVar71 >> 3) & 1);
          auVar121._12_4_ = (float)((uint)bVar12 * auVar99._12_4_ | (uint)!bVar12 * auVar106._12_4_)
          ;
          bVar12 = (bool)((byte)(uVar71 >> 4) & 1);
          auVar121._16_4_ = (float)((uint)bVar12 * auVar99._16_4_ | (uint)!bVar12 * auVar106._16_4_)
          ;
          bVar12 = (bool)((byte)(uVar71 >> 5) & 1);
          auVar121._20_4_ = (float)((uint)bVar12 * auVar99._20_4_ | (uint)!bVar12 * auVar106._20_4_)
          ;
          bVar12 = (bool)((byte)(uVar71 >> 6) & 1);
          auVar121._24_4_ = (float)((uint)bVar12 * auVar99._24_4_ | (uint)!bVar12 * auVar106._24_4_)
          ;
          bVar12 = SUB81(uVar71 >> 7,0);
          auVar121._28_4_ = (uint)bVar12 * auVar99._28_4_ | (uint)!bVar12 * auVar106._28_4_;
          bVar12 = (bool)((byte)uVar71 & 1);
          auVar122._0_4_ = (float)((uint)bVar12 * auVar101._0_4_ | (uint)!bVar12 * auVar96._0_4_);
          bVar12 = (bool)((byte)(uVar71 >> 1) & 1);
          auVar122._4_4_ = (float)((uint)bVar12 * auVar101._4_4_ | (uint)!bVar12 * auVar96._4_4_);
          bVar12 = (bool)((byte)(uVar71 >> 2) & 1);
          auVar122._8_4_ = (float)((uint)bVar12 * auVar101._8_4_ | (uint)!bVar12 * auVar96._8_4_);
          bVar12 = (bool)((byte)(uVar71 >> 3) & 1);
          auVar122._12_4_ = (float)((uint)bVar12 * auVar101._12_4_ | (uint)!bVar12 * auVar96._12_4_)
          ;
          bVar12 = (bool)((byte)(uVar71 >> 4) & 1);
          auVar122._16_4_ = (float)((uint)bVar12 * auVar101._16_4_ | (uint)!bVar12 * auVar96._16_4_)
          ;
          bVar12 = (bool)((byte)(uVar71 >> 5) & 1);
          auVar122._20_4_ = (float)((uint)bVar12 * auVar101._20_4_ | (uint)!bVar12 * auVar96._20_4_)
          ;
          bVar12 = (bool)((byte)(uVar71 >> 6) & 1);
          auVar122._24_4_ = (float)((uint)bVar12 * auVar101._24_4_ | (uint)!bVar12 * auVar96._24_4_)
          ;
          bVar12 = SUB81(uVar71 >> 7,0);
          auVar122._28_4_ = (uint)bVar12 * auVar101._28_4_ | (uint)!bVar12 * auVar96._28_4_;
          vandps_avx512vl(auVar107,auVar102);
          vandps_avx512vl(auVar100,auVar102);
          auVar108 = vmaxps_avx(auVar122,auVar122);
          vandps_avx512vl(auVar109,auVar102);
          auVar108 = vmaxps_avx(auVar108,auVar122);
          uVar71 = vcmpps_avx512vl(auVar108,local_420,1);
          bVar12 = (bool)((byte)uVar71 & 1);
          auVar123._0_4_ = (uint)bVar12 * auVar99._0_4_ | (uint)!bVar12 * auVar107._0_4_;
          bVar12 = (bool)((byte)(uVar71 >> 1) & 1);
          auVar123._4_4_ = (uint)bVar12 * auVar99._4_4_ | (uint)!bVar12 * auVar107._4_4_;
          bVar12 = (bool)((byte)(uVar71 >> 2) & 1);
          auVar123._8_4_ = (uint)bVar12 * auVar99._8_4_ | (uint)!bVar12 * auVar107._8_4_;
          bVar12 = (bool)((byte)(uVar71 >> 3) & 1);
          auVar123._12_4_ = (uint)bVar12 * auVar99._12_4_ | (uint)!bVar12 * auVar107._12_4_;
          bVar12 = (bool)((byte)(uVar71 >> 4) & 1);
          auVar123._16_4_ = (uint)bVar12 * auVar99._16_4_ | (uint)!bVar12 * auVar107._16_4_;
          bVar12 = (bool)((byte)(uVar71 >> 5) & 1);
          auVar123._20_4_ = (uint)bVar12 * auVar99._20_4_ | (uint)!bVar12 * auVar107._20_4_;
          bVar12 = (bool)((byte)(uVar71 >> 6) & 1);
          auVar123._24_4_ = (uint)bVar12 * auVar99._24_4_ | (uint)!bVar12 * auVar107._24_4_;
          bVar12 = SUB81(uVar71 >> 7,0);
          auVar123._28_4_ = (uint)bVar12 * auVar99._28_4_ | (uint)!bVar12 * auVar107._28_4_;
          bVar12 = (bool)((byte)uVar71 & 1);
          auVar124._0_4_ = (float)((uint)bVar12 * auVar101._0_4_ | (uint)!bVar12 * auVar100._0_4_);
          bVar12 = (bool)((byte)(uVar71 >> 1) & 1);
          auVar124._4_4_ = (float)((uint)bVar12 * auVar101._4_4_ | (uint)!bVar12 * auVar100._4_4_);
          bVar12 = (bool)((byte)(uVar71 >> 2) & 1);
          auVar124._8_4_ = (float)((uint)bVar12 * auVar101._8_4_ | (uint)!bVar12 * auVar100._8_4_);
          bVar12 = (bool)((byte)(uVar71 >> 3) & 1);
          auVar124._12_4_ =
               (float)((uint)bVar12 * auVar101._12_4_ | (uint)!bVar12 * auVar100._12_4_);
          bVar12 = (bool)((byte)(uVar71 >> 4) & 1);
          auVar124._16_4_ =
               (float)((uint)bVar12 * auVar101._16_4_ | (uint)!bVar12 * auVar100._16_4_);
          bVar12 = (bool)((byte)(uVar71 >> 5) & 1);
          auVar124._20_4_ =
               (float)((uint)bVar12 * auVar101._20_4_ | (uint)!bVar12 * auVar100._20_4_);
          bVar12 = (bool)((byte)(uVar71 >> 6) & 1);
          auVar124._24_4_ =
               (float)((uint)bVar12 * auVar101._24_4_ | (uint)!bVar12 * auVar100._24_4_);
          bVar12 = SUB81(uVar71 >> 7,0);
          auVar124._28_4_ = (uint)bVar12 * auVar101._28_4_ | (uint)!bVar12 * auVar100._28_4_;
          auVar213._8_4_ = 0x80000000;
          auVar213._0_8_ = 0x8000000080000000;
          auVar213._12_4_ = 0x80000000;
          auVar213._16_4_ = 0x80000000;
          auVar213._20_4_ = 0x80000000;
          auVar213._24_4_ = 0x80000000;
          auVar213._28_4_ = 0x80000000;
          auVar108 = vxorps_avx512vl(auVar123,auVar213);
          auVar84 = vxorps_avx512vl(auVar102._0_16_,auVar102._0_16_);
          auVar109 = vfmadd213ps_avx512vl(auVar121,auVar121,ZEXT1632(auVar84));
          auVar19 = vfmadd231ps_fma(auVar109,auVar122,auVar122);
          auVar109 = vrsqrt14ps_avx512vl(ZEXT1632(auVar19));
          auVar220._8_4_ = 0xbf000000;
          auVar220._0_8_ = 0xbf000000bf000000;
          auVar220._12_4_ = 0xbf000000;
          auVar220._16_4_ = 0xbf000000;
          auVar220._20_4_ = 0xbf000000;
          auVar220._24_4_ = 0xbf000000;
          auVar220._28_4_ = 0xbf000000;
          fVar165 = auVar109._0_4_;
          fVar153 = auVar109._4_4_;
          fVar154 = auVar109._8_4_;
          fVar155 = auVar109._12_4_;
          fVar210 = auVar109._16_4_;
          fVar179 = auVar109._20_4_;
          fVar82 = auVar109._24_4_;
          auVar54._4_4_ = fVar153 * fVar153 * fVar153 * auVar19._4_4_ * -0.5;
          auVar54._0_4_ = fVar165 * fVar165 * fVar165 * auVar19._0_4_ * -0.5;
          auVar54._8_4_ = fVar154 * fVar154 * fVar154 * auVar19._8_4_ * -0.5;
          auVar54._12_4_ = fVar155 * fVar155 * fVar155 * auVar19._12_4_ * -0.5;
          auVar54._16_4_ = fVar210 * fVar210 * fVar210 * -0.0;
          auVar54._20_4_ = fVar179 * fVar179 * fVar179 * -0.0;
          auVar54._24_4_ = fVar82 * fVar82 * fVar82 * -0.0;
          auVar54._28_4_ = auVar122._28_4_;
          auVar107 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
          auVar109 = vfmadd231ps_avx512vl(auVar54,auVar107,auVar109);
          auVar55._4_4_ = auVar122._4_4_ * auVar109._4_4_;
          auVar55._0_4_ = auVar122._0_4_ * auVar109._0_4_;
          auVar55._8_4_ = auVar122._8_4_ * auVar109._8_4_;
          auVar55._12_4_ = auVar122._12_4_ * auVar109._12_4_;
          auVar55._16_4_ = auVar122._16_4_ * auVar109._16_4_;
          auVar55._20_4_ = auVar122._20_4_ * auVar109._20_4_;
          auVar55._24_4_ = auVar122._24_4_ * auVar109._24_4_;
          auVar55._28_4_ = 0;
          auVar56._4_4_ = auVar109._4_4_ * -auVar121._4_4_;
          auVar56._0_4_ = auVar109._0_4_ * -auVar121._0_4_;
          auVar56._8_4_ = auVar109._8_4_ * -auVar121._8_4_;
          auVar56._12_4_ = auVar109._12_4_ * -auVar121._12_4_;
          auVar56._16_4_ = auVar109._16_4_ * -auVar121._16_4_;
          auVar56._20_4_ = auVar109._20_4_ * -auVar121._20_4_;
          auVar56._24_4_ = auVar109._24_4_ * -auVar121._24_4_;
          auVar56._28_4_ = auVar122._28_4_;
          auVar106 = vmulps_avx512vl(auVar109,ZEXT1632(auVar84));
          auVar105 = ZEXT1632(auVar84);
          auVar109 = vfmadd213ps_avx512vl(auVar123,auVar123,auVar105);
          auVar109 = vfmadd231ps_avx512vl(auVar109,auVar124,auVar124);
          auVar96 = vrsqrt14ps_avx512vl(auVar109);
          auVar109 = vmulps_avx512vl(auVar109,auVar220);
          fVar165 = auVar96._0_4_;
          fVar153 = auVar96._4_4_;
          fVar154 = auVar96._8_4_;
          fVar155 = auVar96._12_4_;
          fVar210 = auVar96._16_4_;
          fVar179 = auVar96._20_4_;
          fVar82 = auVar96._24_4_;
          auVar57._4_4_ = fVar153 * fVar153 * fVar153 * auVar109._4_4_;
          auVar57._0_4_ = fVar165 * fVar165 * fVar165 * auVar109._0_4_;
          auVar57._8_4_ = fVar154 * fVar154 * fVar154 * auVar109._8_4_;
          auVar57._12_4_ = fVar155 * fVar155 * fVar155 * auVar109._12_4_;
          auVar57._16_4_ = fVar210 * fVar210 * fVar210 * auVar109._16_4_;
          auVar57._20_4_ = fVar179 * fVar179 * fVar179 * auVar109._20_4_;
          auVar57._24_4_ = fVar82 * fVar82 * fVar82 * auVar109._24_4_;
          auVar57._28_4_ = auVar109._28_4_;
          auVar109 = vfmadd231ps_avx512vl(auVar57,auVar107,auVar96);
          auVar58._4_4_ = auVar124._4_4_ * auVar109._4_4_;
          auVar58._0_4_ = auVar124._0_4_ * auVar109._0_4_;
          auVar58._8_4_ = auVar124._8_4_ * auVar109._8_4_;
          auVar58._12_4_ = auVar124._12_4_ * auVar109._12_4_;
          auVar58._16_4_ = auVar124._16_4_ * auVar109._16_4_;
          auVar58._20_4_ = auVar124._20_4_ * auVar109._20_4_;
          auVar58._24_4_ = auVar124._24_4_ * auVar109._24_4_;
          auVar58._28_4_ = auVar96._28_4_;
          auVar59._4_4_ = auVar109._4_4_ * auVar108._4_4_;
          auVar59._0_4_ = auVar109._0_4_ * auVar108._0_4_;
          auVar59._8_4_ = auVar109._8_4_ * auVar108._8_4_;
          auVar59._12_4_ = auVar109._12_4_ * auVar108._12_4_;
          auVar59._16_4_ = auVar109._16_4_ * auVar108._16_4_;
          auVar59._20_4_ = auVar109._20_4_ * auVar108._20_4_;
          auVar59._24_4_ = auVar109._24_4_ * auVar108._24_4_;
          auVar59._28_4_ = auVar108._28_4_;
          auVar108 = vmulps_avx512vl(auVar109,auVar105);
          auVar19 = vfmadd213ps_fma(auVar55,auVar97,ZEXT1632(auVar88));
          auVar86 = vfmadd213ps_fma(auVar56,auVar97,ZEXT1632(auVar89));
          auVar107 = vfmadd213ps_avx512vl(auVar106,auVar97,auVar95);
          auVar96 = vfmadd213ps_avx512vl(auVar58,auVar98,ZEXT1632(auVar85));
          auVar21 = vfnmadd213ps_fma(auVar55,auVar97,ZEXT1632(auVar88));
          auVar88 = vfmadd213ps_fma(auVar59,auVar98,ZEXT1632(auVar18));
          auVar87 = vfnmadd213ps_fma(auVar56,auVar97,ZEXT1632(auVar89));
          auVar89 = vfmadd213ps_fma(auVar108,auVar98,auVar94);
          auVar28 = vfnmadd231ps_fma(auVar95,auVar97,auVar106);
          auVar22 = vfnmadd213ps_fma(auVar58,auVar98,ZEXT1632(auVar85));
          auVar23 = vfnmadd213ps_fma(auVar59,auVar98,ZEXT1632(auVar18));
          auVar29 = vfnmadd231ps_fma(auVar94,auVar98,auVar108);
          auVar94 = vsubps_avx512vl(auVar96,ZEXT1632(auVar21));
          auVar108 = vsubps_avx(ZEXT1632(auVar88),ZEXT1632(auVar87));
          auVar109 = vsubps_avx(ZEXT1632(auVar89),ZEXT1632(auVar28));
          auVar60._4_4_ = auVar108._4_4_ * auVar28._4_4_;
          auVar60._0_4_ = auVar108._0_4_ * auVar28._0_4_;
          auVar60._8_4_ = auVar108._8_4_ * auVar28._8_4_;
          auVar60._12_4_ = auVar108._12_4_ * auVar28._12_4_;
          auVar60._16_4_ = auVar108._16_4_ * 0.0;
          auVar60._20_4_ = auVar108._20_4_ * 0.0;
          auVar60._24_4_ = auVar108._24_4_ * 0.0;
          auVar60._28_4_ = auVar106._28_4_;
          auVar85 = vfmsub231ps_fma(auVar60,ZEXT1632(auVar87),auVar109);
          auVar61._4_4_ = auVar109._4_4_ * auVar21._4_4_;
          auVar61._0_4_ = auVar109._0_4_ * auVar21._0_4_;
          auVar61._8_4_ = auVar109._8_4_ * auVar21._8_4_;
          auVar61._12_4_ = auVar109._12_4_ * auVar21._12_4_;
          auVar61._16_4_ = auVar109._16_4_ * 0.0;
          auVar61._20_4_ = auVar109._20_4_ * 0.0;
          auVar61._24_4_ = auVar109._24_4_ * 0.0;
          auVar61._28_4_ = auVar109._28_4_;
          auVar18 = vfmsub231ps_fma(auVar61,ZEXT1632(auVar28),auVar94);
          auVar62._4_4_ = auVar87._4_4_ * auVar94._4_4_;
          auVar62._0_4_ = auVar87._0_4_ * auVar94._0_4_;
          auVar62._8_4_ = auVar87._8_4_ * auVar94._8_4_;
          auVar62._12_4_ = auVar87._12_4_ * auVar94._12_4_;
          auVar62._16_4_ = auVar94._16_4_ * 0.0;
          auVar62._20_4_ = auVar94._20_4_ * 0.0;
          auVar62._24_4_ = auVar94._24_4_ * 0.0;
          auVar62._28_4_ = auVar94._28_4_;
          auVar20 = vfmsub231ps_fma(auVar62,ZEXT1632(auVar21),auVar108);
          auVar108 = vfmadd231ps_avx512vl(ZEXT1632(auVar20),auVar105,ZEXT1632(auVar18));
          auVar108 = vfmadd231ps_avx512vl(auVar108,auVar105,ZEXT1632(auVar85));
          auVar102 = ZEXT1632(auVar84);
          uVar71 = vcmpps_avx512vl(auVar108,auVar102,2);
          bVar70 = (byte)uVar71;
          fVar135 = (float)((uint)(bVar70 & 1) * auVar19._0_4_ |
                           (uint)!(bool)(bVar70 & 1) * auVar22._0_4_);
          bVar12 = (bool)((byte)(uVar71 >> 1) & 1);
          fVar137 = (float)((uint)bVar12 * auVar19._4_4_ | (uint)!bVar12 * auVar22._4_4_);
          bVar12 = (bool)((byte)(uVar71 >> 2) & 1);
          fVar140 = (float)((uint)bVar12 * auVar19._8_4_ | (uint)!bVar12 * auVar22._8_4_);
          bVar12 = (bool)((byte)(uVar71 >> 3) & 1);
          fVar141 = (float)((uint)bVar12 * auVar19._12_4_ | (uint)!bVar12 * auVar22._12_4_);
          auVar105 = ZEXT1632(CONCAT412(fVar141,CONCAT48(fVar140,CONCAT44(fVar137,fVar135))));
          fVar136 = (float)((uint)(bVar70 & 1) * auVar86._0_4_ |
                           (uint)!(bool)(bVar70 & 1) * auVar23._0_4_);
          bVar12 = (bool)((byte)(uVar71 >> 1) & 1);
          fVar139 = (float)((uint)bVar12 * auVar86._4_4_ | (uint)!bVar12 * auVar23._4_4_);
          bVar12 = (bool)((byte)(uVar71 >> 2) & 1);
          fVar138 = (float)((uint)bVar12 * auVar86._8_4_ | (uint)!bVar12 * auVar23._8_4_);
          bVar12 = (bool)((byte)(uVar71 >> 3) & 1);
          fVar142 = (float)((uint)bVar12 * auVar86._12_4_ | (uint)!bVar12 * auVar23._12_4_);
          auVar99 = ZEXT1632(CONCAT412(fVar142,CONCAT48(fVar138,CONCAT44(fVar139,fVar136))));
          auVar125._0_4_ =
               (float)((uint)(bVar70 & 1) * auVar107._0_4_ |
                      (uint)!(bool)(bVar70 & 1) * auVar29._0_4_);
          bVar12 = (bool)((byte)(uVar71 >> 1) & 1);
          auVar125._4_4_ = (float)((uint)bVar12 * auVar107._4_4_ | (uint)!bVar12 * auVar29._4_4_);
          bVar12 = (bool)((byte)(uVar71 >> 2) & 1);
          auVar125._8_4_ = (float)((uint)bVar12 * auVar107._8_4_ | (uint)!bVar12 * auVar29._8_4_);
          bVar12 = (bool)((byte)(uVar71 >> 3) & 1);
          auVar125._12_4_ = (float)((uint)bVar12 * auVar107._12_4_ | (uint)!bVar12 * auVar29._12_4_)
          ;
          fVar154 = (float)((uint)((byte)(uVar71 >> 4) & 1) * auVar107._16_4_);
          auVar125._16_4_ = fVar154;
          fVar153 = (float)((uint)((byte)(uVar71 >> 5) & 1) * auVar107._20_4_);
          auVar125._20_4_ = fVar153;
          fVar165 = (float)((uint)((byte)(uVar71 >> 6) & 1) * auVar107._24_4_);
          auVar125._24_4_ = fVar165;
          iVar1 = (uint)(byte)(uVar71 >> 7) * auVar107._28_4_;
          auVar125._28_4_ = iVar1;
          auVar108 = vblendmps_avx512vl(ZEXT1632(auVar21),auVar96);
          auVar126._0_4_ =
               (uint)(bVar70 & 1) * auVar108._0_4_ | (uint)!(bool)(bVar70 & 1) * auVar85._0_4_;
          bVar12 = (bool)((byte)(uVar71 >> 1) & 1);
          auVar126._4_4_ = (uint)bVar12 * auVar108._4_4_ | (uint)!bVar12 * auVar85._4_4_;
          bVar12 = (bool)((byte)(uVar71 >> 2) & 1);
          auVar126._8_4_ = (uint)bVar12 * auVar108._8_4_ | (uint)!bVar12 * auVar85._8_4_;
          bVar12 = (bool)((byte)(uVar71 >> 3) & 1);
          auVar126._12_4_ = (uint)bVar12 * auVar108._12_4_ | (uint)!bVar12 * auVar85._12_4_;
          auVar126._16_4_ = (uint)((byte)(uVar71 >> 4) & 1) * auVar108._16_4_;
          auVar126._20_4_ = (uint)((byte)(uVar71 >> 5) & 1) * auVar108._20_4_;
          auVar126._24_4_ = (uint)((byte)(uVar71 >> 6) & 1) * auVar108._24_4_;
          auVar126._28_4_ = (uint)(byte)(uVar71 >> 7) * auVar108._28_4_;
          auVar108 = vblendmps_avx512vl(ZEXT1632(auVar87),ZEXT1632(auVar88));
          auVar127._0_4_ =
               (float)((uint)(bVar70 & 1) * auVar108._0_4_ |
                      (uint)!(bool)(bVar70 & 1) * auVar19._0_4_);
          bVar12 = (bool)((byte)(uVar71 >> 1) & 1);
          auVar127._4_4_ = (float)((uint)bVar12 * auVar108._4_4_ | (uint)!bVar12 * auVar19._4_4_);
          bVar12 = (bool)((byte)(uVar71 >> 2) & 1);
          auVar127._8_4_ = (float)((uint)bVar12 * auVar108._8_4_ | (uint)!bVar12 * auVar19._8_4_);
          bVar12 = (bool)((byte)(uVar71 >> 3) & 1);
          auVar127._12_4_ = (float)((uint)bVar12 * auVar108._12_4_ | (uint)!bVar12 * auVar19._12_4_)
          ;
          fVar179 = (float)((uint)((byte)(uVar71 >> 4) & 1) * auVar108._16_4_);
          auVar127._16_4_ = fVar179;
          fVar210 = (float)((uint)((byte)(uVar71 >> 5) & 1) * auVar108._20_4_);
          auVar127._20_4_ = fVar210;
          fVar155 = (float)((uint)((byte)(uVar71 >> 6) & 1) * auVar108._24_4_);
          auVar127._24_4_ = fVar155;
          auVar127._28_4_ = (uint)(byte)(uVar71 >> 7) * auVar108._28_4_;
          auVar108 = vblendmps_avx512vl(ZEXT1632(auVar28),ZEXT1632(auVar89));
          auVar128._0_4_ =
               (float)((uint)(bVar70 & 1) * auVar108._0_4_ |
                      (uint)!(bool)(bVar70 & 1) * auVar86._0_4_);
          bVar12 = (bool)((byte)(uVar71 >> 1) & 1);
          auVar128._4_4_ = (float)((uint)bVar12 * auVar108._4_4_ | (uint)!bVar12 * auVar86._4_4_);
          bVar12 = (bool)((byte)(uVar71 >> 2) & 1);
          auVar128._8_4_ = (float)((uint)bVar12 * auVar108._8_4_ | (uint)!bVar12 * auVar86._8_4_);
          bVar12 = (bool)((byte)(uVar71 >> 3) & 1);
          auVar128._12_4_ = (float)((uint)bVar12 * auVar108._12_4_ | (uint)!bVar12 * auVar86._12_4_)
          ;
          fVar82 = (float)((uint)((byte)(uVar71 >> 4) & 1) * auVar108._16_4_);
          auVar128._16_4_ = fVar82;
          fVar83 = (float)((uint)((byte)(uVar71 >> 5) & 1) * auVar108._20_4_);
          auVar128._20_4_ = fVar83;
          fVar134 = (float)((uint)((byte)(uVar71 >> 6) & 1) * auVar108._24_4_);
          auVar128._24_4_ = fVar134;
          iVar2 = (uint)(byte)(uVar71 >> 7) * auVar108._28_4_;
          auVar128._28_4_ = iVar2;
          auVar129._0_4_ =
               (uint)(bVar70 & 1) * (int)auVar21._0_4_ | (uint)!(bool)(bVar70 & 1) * auVar96._0_4_;
          bVar12 = (bool)((byte)(uVar71 >> 1) & 1);
          auVar129._4_4_ = (uint)bVar12 * (int)auVar21._4_4_ | (uint)!bVar12 * auVar96._4_4_;
          bVar12 = (bool)((byte)(uVar71 >> 2) & 1);
          auVar129._8_4_ = (uint)bVar12 * (int)auVar21._8_4_ | (uint)!bVar12 * auVar96._8_4_;
          bVar12 = (bool)((byte)(uVar71 >> 3) & 1);
          auVar129._12_4_ = (uint)bVar12 * (int)auVar21._12_4_ | (uint)!bVar12 * auVar96._12_4_;
          auVar129._16_4_ = (uint)!(bool)((byte)(uVar71 >> 4) & 1) * auVar96._16_4_;
          auVar129._20_4_ = (uint)!(bool)((byte)(uVar71 >> 5) & 1) * auVar96._20_4_;
          auVar129._24_4_ = (uint)!(bool)((byte)(uVar71 >> 6) & 1) * auVar96._24_4_;
          auVar129._28_4_ = (uint)!SUB81(uVar71 >> 7,0) * auVar96._28_4_;
          bVar12 = (bool)((byte)(uVar71 >> 1) & 1);
          bVar14 = (bool)((byte)(uVar71 >> 2) & 1);
          bVar16 = (bool)((byte)(uVar71 >> 3) & 1);
          bVar13 = (bool)((byte)(uVar71 >> 1) & 1);
          bVar15 = (bool)((byte)(uVar71 >> 2) & 1);
          bVar17 = (bool)((byte)(uVar71 >> 3) & 1);
          auVar96 = vsubps_avx512vl(auVar129,auVar105);
          auVar109 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar16 * (int)auVar87._12_4_ |
                                                   (uint)!bVar16 * auVar88._12_4_,
                                                   CONCAT48((uint)bVar14 * (int)auVar87._8_4_ |
                                                            (uint)!bVar14 * auVar88._8_4_,
                                                            CONCAT44((uint)bVar12 *
                                                                     (int)auVar87._4_4_ |
                                                                     (uint)!bVar12 * auVar88._4_4_,
                                                                     (uint)(bVar70 & 1) *
                                                                     (int)auVar87._0_4_ |
                                                                     (uint)!(bool)(bVar70 & 1) *
                                                                     auVar88._0_4_)))),auVar99);
          auVar201 = ZEXT3264(auVar109);
          auVar107 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar17 * (int)auVar28._12_4_ |
                                                   (uint)!bVar17 * auVar89._12_4_,
                                                   CONCAT48((uint)bVar15 * (int)auVar28._8_4_ |
                                                            (uint)!bVar15 * auVar89._8_4_,
                                                            CONCAT44((uint)bVar13 *
                                                                     (int)auVar28._4_4_ |
                                                                     (uint)!bVar13 * auVar89._4_4_,
                                                                     (uint)(bVar70 & 1) *
                                                                     (int)auVar28._0_4_ |
                                                                     (uint)!(bool)(bVar70 & 1) *
                                                                     auVar89._0_4_)))),auVar125);
          auVar106 = vsubps_avx(auVar105,auVar126);
          auVar207 = ZEXT3264(auVar106);
          auVar94 = vsubps_avx(auVar99,auVar127);
          auVar95 = vsubps_avx(auVar125,auVar128);
          auVar63._4_4_ = auVar107._4_4_ * fVar137;
          auVar63._0_4_ = auVar107._0_4_ * fVar135;
          auVar63._8_4_ = auVar107._8_4_ * fVar140;
          auVar63._12_4_ = auVar107._12_4_ * fVar141;
          auVar63._16_4_ = auVar107._16_4_ * 0.0;
          auVar63._20_4_ = auVar107._20_4_ * 0.0;
          auVar63._24_4_ = auVar107._24_4_ * 0.0;
          auVar63._28_4_ = 0;
          auVar88 = vfmsub231ps_fma(auVar63,auVar125,auVar96);
          auVar182._0_4_ = fVar136 * auVar96._0_4_;
          auVar182._4_4_ = fVar139 * auVar96._4_4_;
          auVar182._8_4_ = fVar138 * auVar96._8_4_;
          auVar182._12_4_ = fVar142 * auVar96._12_4_;
          auVar182._16_4_ = auVar96._16_4_ * 0.0;
          auVar182._20_4_ = auVar96._20_4_ * 0.0;
          auVar182._24_4_ = auVar96._24_4_ * 0.0;
          auVar182._28_4_ = 0;
          auVar89 = vfmsub231ps_fma(auVar182,auVar105,auVar109);
          auVar108 = vfmadd231ps_avx512vl(ZEXT1632(auVar89),auVar102,ZEXT1632(auVar88));
          auVar196._0_4_ = auVar109._0_4_ * auVar125._0_4_;
          auVar196._4_4_ = auVar109._4_4_ * auVar125._4_4_;
          auVar196._8_4_ = auVar109._8_4_ * auVar125._8_4_;
          auVar196._12_4_ = auVar109._12_4_ * auVar125._12_4_;
          auVar196._16_4_ = auVar109._16_4_ * fVar154;
          auVar196._20_4_ = auVar109._20_4_ * fVar153;
          auVar196._24_4_ = auVar109._24_4_ * fVar165;
          auVar196._28_4_ = 0;
          auVar88 = vfmsub231ps_fma(auVar196,auVar99,auVar107);
          auVar100 = vfmadd231ps_avx512vl(auVar108,auVar102,ZEXT1632(auVar88));
          auVar108 = vmulps_avx512vl(auVar95,auVar126);
          auVar108 = vfmsub231ps_avx512vl(auVar108,auVar106,auVar128);
          auVar64._4_4_ = auVar94._4_4_ * auVar128._4_4_;
          auVar64._0_4_ = auVar94._0_4_ * auVar128._0_4_;
          auVar64._8_4_ = auVar94._8_4_ * auVar128._8_4_;
          auVar64._12_4_ = auVar94._12_4_ * auVar128._12_4_;
          auVar64._16_4_ = auVar94._16_4_ * fVar82;
          auVar64._20_4_ = auVar94._20_4_ * fVar83;
          auVar64._24_4_ = auVar94._24_4_ * fVar134;
          auVar64._28_4_ = iVar2;
          auVar88 = vfmsub231ps_fma(auVar64,auVar127,auVar95);
          auVar197._0_4_ = auVar127._0_4_ * auVar106._0_4_;
          auVar197._4_4_ = auVar127._4_4_ * auVar106._4_4_;
          auVar197._8_4_ = auVar127._8_4_ * auVar106._8_4_;
          auVar197._12_4_ = auVar127._12_4_ * auVar106._12_4_;
          auVar197._16_4_ = fVar179 * auVar106._16_4_;
          auVar197._20_4_ = fVar210 * auVar106._20_4_;
          auVar197._24_4_ = fVar155 * auVar106._24_4_;
          auVar197._28_4_ = 0;
          auVar89 = vfmsub231ps_fma(auVar197,auVar94,auVar126);
          auVar108 = vfmadd231ps_avx512vl(ZEXT1632(auVar89),auVar102,auVar108);
          auVar101 = vfmadd231ps_avx512vl(auVar108,auVar102,ZEXT1632(auVar88));
          auVar198 = ZEXT3264(auVar101);
          auVar108 = vmaxps_avx(auVar100,auVar101);
          uVar156 = vcmpps_avx512vl(auVar108,auVar102,2);
          bVar80 = bVar80 & (byte)uVar156;
          if (bVar80 != 0) {
            auVar65._4_4_ = auVar95._4_4_ * auVar109._4_4_;
            auVar65._0_4_ = auVar95._0_4_ * auVar109._0_4_;
            auVar65._8_4_ = auVar95._8_4_ * auVar109._8_4_;
            auVar65._12_4_ = auVar95._12_4_ * auVar109._12_4_;
            auVar65._16_4_ = auVar95._16_4_ * auVar109._16_4_;
            auVar65._20_4_ = auVar95._20_4_ * auVar109._20_4_;
            auVar65._24_4_ = auVar95._24_4_ * auVar109._24_4_;
            auVar65._28_4_ = auVar108._28_4_;
            auVar18 = vfmsub231ps_fma(auVar65,auVar94,auVar107);
            auVar66._4_4_ = auVar107._4_4_ * auVar106._4_4_;
            auVar66._0_4_ = auVar107._0_4_ * auVar106._0_4_;
            auVar66._8_4_ = auVar107._8_4_ * auVar106._8_4_;
            auVar66._12_4_ = auVar107._12_4_ * auVar106._12_4_;
            auVar66._16_4_ = auVar107._16_4_ * auVar106._16_4_;
            auVar66._20_4_ = auVar107._20_4_ * auVar106._20_4_;
            auVar66._24_4_ = auVar107._24_4_ * auVar106._24_4_;
            auVar66._28_4_ = auVar107._28_4_;
            auVar85 = vfmsub231ps_fma(auVar66,auVar96,auVar95);
            auVar67._4_4_ = auVar94._4_4_ * auVar96._4_4_;
            auVar67._0_4_ = auVar94._0_4_ * auVar96._0_4_;
            auVar67._8_4_ = auVar94._8_4_ * auVar96._8_4_;
            auVar67._12_4_ = auVar94._12_4_ * auVar96._12_4_;
            auVar67._16_4_ = auVar94._16_4_ * auVar96._16_4_;
            auVar67._20_4_ = auVar94._20_4_ * auVar96._20_4_;
            auVar67._24_4_ = auVar94._24_4_ * auVar96._24_4_;
            auVar67._28_4_ = auVar94._28_4_;
            auVar19 = vfmsub231ps_fma(auVar67,auVar106,auVar109);
            auVar88 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar85),ZEXT1632(auVar19));
            auVar89 = vfmadd231ps_fma(ZEXT1632(auVar88),ZEXT1632(auVar18),
                                      ZEXT1232(ZEXT412(0)) << 0x20);
            auVar108 = vrcp14ps_avx512vl(ZEXT1632(auVar89));
            auVar39._8_4_ = 0x3f800000;
            auVar39._0_8_ = 0x3f8000003f800000;
            auVar39._12_4_ = 0x3f800000;
            auVar39._16_4_ = 0x3f800000;
            auVar39._20_4_ = 0x3f800000;
            auVar39._24_4_ = 0x3f800000;
            auVar39._28_4_ = 0x3f800000;
            auVar109 = vfnmadd213ps_avx512vl(auVar108,ZEXT1632(auVar89),auVar39);
            auVar88 = vfmadd132ps_fma(auVar109,auVar108,auVar108);
            auVar201 = ZEXT1664(auVar88);
            auVar68._4_4_ = auVar19._4_4_ * auVar125._4_4_;
            auVar68._0_4_ = auVar19._0_4_ * auVar125._0_4_;
            auVar68._8_4_ = auVar19._8_4_ * auVar125._8_4_;
            auVar68._12_4_ = auVar19._12_4_ * auVar125._12_4_;
            auVar68._16_4_ = fVar154 * 0.0;
            auVar68._20_4_ = fVar153 * 0.0;
            auVar68._24_4_ = fVar165 * 0.0;
            auVar68._28_4_ = iVar1;
            auVar85 = vfmadd231ps_fma(auVar68,auVar99,ZEXT1632(auVar85));
            auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar105,ZEXT1632(auVar18));
            fVar153 = auVar88._0_4_;
            fVar154 = auVar88._4_4_;
            fVar155 = auVar88._8_4_;
            fVar210 = auVar88._12_4_;
            local_280._28_4_ = auVar108._28_4_;
            local_280._0_28_ =
                 ZEXT1628(CONCAT412(auVar85._12_4_ * fVar210,
                                    CONCAT48(auVar85._8_4_ * fVar155,
                                             CONCAT44(auVar85._4_4_ * fVar154,
                                                      auVar85._0_4_ * fVar153))));
            auVar207 = ZEXT3264(local_280);
            uVar156 = vcmpps_avx512vl(local_280,local_3e0,0xd);
            fVar165 = (ray->super_RayK<1>).tfar;
            auVar40._4_4_ = fVar165;
            auVar40._0_4_ = fVar165;
            auVar40._8_4_ = fVar165;
            auVar40._12_4_ = fVar165;
            auVar40._16_4_ = fVar165;
            auVar40._20_4_ = fVar165;
            auVar40._24_4_ = fVar165;
            auVar40._28_4_ = fVar165;
            uVar24 = vcmpps_avx512vl(local_280,auVar40,2);
            bVar80 = (byte)uVar156 & (byte)uVar24 & bVar80;
            if (bVar80 != 0) {
              uVar81 = vcmpps_avx512vl(ZEXT1632(auVar89),ZEXT1232(ZEXT412(0)) << 0x20,4);
              uVar81 = bVar80 & uVar81;
              if ((char)uVar81 != '\0') {
                fVar165 = auVar100._0_4_ * fVar153;
                fVar179 = auVar100._4_4_ * fVar154;
                auVar69._4_4_ = fVar179;
                auVar69._0_4_ = fVar165;
                fVar82 = auVar100._8_4_ * fVar155;
                auVar69._8_4_ = fVar82;
                fVar83 = auVar100._12_4_ * fVar210;
                auVar69._12_4_ = fVar83;
                fVar134 = auVar100._16_4_ * 0.0;
                auVar69._16_4_ = fVar134;
                fVar135 = auVar100._20_4_ * 0.0;
                auVar69._20_4_ = fVar135;
                fVar136 = auVar100._24_4_ * 0.0;
                auVar69._24_4_ = fVar136;
                auVar69._28_4_ = auVar100._28_4_;
                auVar178._8_4_ = 0x3f800000;
                auVar178._0_8_ = 0x3f8000003f800000;
                auVar178._12_4_ = 0x3f800000;
                auVar178._16_4_ = 0x3f800000;
                auVar178._20_4_ = 0x3f800000;
                auVar178._24_4_ = 0x3f800000;
                auVar178._28_4_ = 0x3f800000;
                auVar108 = vsubps_avx(auVar178,auVar69);
                local_2c0._0_4_ =
                     (float)((uint)(bVar70 & 1) * (int)fVar165 |
                            (uint)!(bool)(bVar70 & 1) * auVar108._0_4_);
                bVar12 = (bool)((byte)(uVar71 >> 1) & 1);
                local_2c0._4_4_ =
                     (float)((uint)bVar12 * (int)fVar179 | (uint)!bVar12 * auVar108._4_4_);
                bVar12 = (bool)((byte)(uVar71 >> 2) & 1);
                local_2c0._8_4_ =
                     (float)((uint)bVar12 * (int)fVar82 | (uint)!bVar12 * auVar108._8_4_);
                bVar12 = (bool)((byte)(uVar71 >> 3) & 1);
                local_2c0._12_4_ =
                     (float)((uint)bVar12 * (int)fVar83 | (uint)!bVar12 * auVar108._12_4_);
                bVar12 = (bool)((byte)(uVar71 >> 4) & 1);
                local_2c0._16_4_ =
                     (float)((uint)bVar12 * (int)fVar134 | (uint)!bVar12 * auVar108._16_4_);
                bVar12 = (bool)((byte)(uVar71 >> 5) & 1);
                local_2c0._20_4_ =
                     (float)((uint)bVar12 * (int)fVar135 | (uint)!bVar12 * auVar108._20_4_);
                bVar12 = (bool)((byte)(uVar71 >> 6) & 1);
                local_2c0._24_4_ =
                     (float)((uint)bVar12 * (int)fVar136 | (uint)!bVar12 * auVar108._24_4_);
                bVar12 = SUB81(uVar71 >> 7,0);
                local_2c0._28_4_ =
                     (float)((uint)bVar12 * auVar100._28_4_ | (uint)!bVar12 * auVar108._28_4_);
                auVar108 = vsubps_avx(auVar98,auVar97);
                auVar88 = vfmadd213ps_fma(auVar108,local_2c0,auVar97);
                fVar165 = local_518->depth_scale;
                auVar41._4_4_ = fVar165;
                auVar41._0_4_ = fVar165;
                auVar41._8_4_ = fVar165;
                auVar41._12_4_ = fVar165;
                auVar41._16_4_ = fVar165;
                auVar41._20_4_ = fVar165;
                auVar41._24_4_ = fVar165;
                auVar41._28_4_ = fVar165;
                auVar108 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar88._12_4_ + auVar88._12_4_,
                                                              CONCAT48(auVar88._8_4_ + auVar88._8_4_
                                                                       ,CONCAT44(auVar88._4_4_ +
                                                                                 auVar88._4_4_,
                                                                                 auVar88._0_4_ +
                                                                                 auVar88._0_4_)))),
                                           auVar41);
                uVar25 = vcmpps_avx512vl(local_280,auVar108,6);
                uVar81 = uVar81 & uVar25;
                bVar80 = (byte)uVar81;
                if (bVar80 != 0) {
                  auVar164._0_4_ = auVar101._0_4_ * fVar153;
                  auVar164._4_4_ = auVar101._4_4_ * fVar154;
                  auVar164._8_4_ = auVar101._8_4_ * fVar155;
                  auVar164._12_4_ = auVar101._12_4_ * fVar210;
                  auVar164._16_4_ = auVar101._16_4_ * 0.0;
                  auVar164._20_4_ = auVar101._20_4_ * 0.0;
                  auVar164._24_4_ = auVar101._24_4_ * 0.0;
                  auVar164._28_4_ = 0;
                  auVar183._8_4_ = 0x3f800000;
                  auVar183._0_8_ = 0x3f8000003f800000;
                  auVar183._12_4_ = 0x3f800000;
                  auVar183._16_4_ = 0x3f800000;
                  auVar183._20_4_ = 0x3f800000;
                  auVar183._24_4_ = 0x3f800000;
                  auVar183._28_4_ = 0x3f800000;
                  auVar108 = vsubps_avx(auVar183,auVar164);
                  auVar130._0_4_ =
                       (uint)(bVar70 & 1) * (int)auVar164._0_4_ |
                       (uint)!(bool)(bVar70 & 1) * auVar108._0_4_;
                  bVar12 = (bool)((byte)(uVar71 >> 1) & 1);
                  auVar130._4_4_ =
                       (uint)bVar12 * (int)auVar164._4_4_ | (uint)!bVar12 * auVar108._4_4_;
                  bVar12 = (bool)((byte)(uVar71 >> 2) & 1);
                  auVar130._8_4_ =
                       (uint)bVar12 * (int)auVar164._8_4_ | (uint)!bVar12 * auVar108._8_4_;
                  bVar12 = (bool)((byte)(uVar71 >> 3) & 1);
                  auVar130._12_4_ =
                       (uint)bVar12 * (int)auVar164._12_4_ | (uint)!bVar12 * auVar108._12_4_;
                  bVar12 = (bool)((byte)(uVar71 >> 4) & 1);
                  auVar130._16_4_ =
                       (uint)bVar12 * (int)auVar164._16_4_ | (uint)!bVar12 * auVar108._16_4_;
                  bVar12 = (bool)((byte)(uVar71 >> 5) & 1);
                  auVar130._20_4_ =
                       (uint)bVar12 * (int)auVar164._20_4_ | (uint)!bVar12 * auVar108._20_4_;
                  bVar12 = (bool)((byte)(uVar71 >> 6) & 1);
                  auVar130._24_4_ =
                       (uint)bVar12 * (int)auVar164._24_4_ | (uint)!bVar12 * auVar108._24_4_;
                  auVar130._28_4_ = (uint)!SUB81(uVar71 >> 7,0) * auVar108._28_4_;
                  auVar42._8_4_ = 0x40000000;
                  auVar42._0_8_ = 0x4000000040000000;
                  auVar42._12_4_ = 0x40000000;
                  auVar42._16_4_ = 0x40000000;
                  auVar42._20_4_ = 0x40000000;
                  auVar42._24_4_ = 0x40000000;
                  auVar42._28_4_ = 0x40000000;
                  local_2a0 = vfmsub132ps_avx512vl(auVar130,auVar183,auVar42);
                  local_260 = (int)lVar76;
                  local_25c = iVar8;
                  local_250 = local_4b0._0_8_;
                  uStack_248 = local_4b0._8_8_;
                  local_240 = local_4c0._0_8_;
                  uStack_238 = local_4c0._8_8_;
                  local_230 = local_4d0._0_8_;
                  uStack_228 = local_4d0._8_8_;
                  local_220 = local_4e0;
                  uStack_218 = uStack_4d8;
                  pGVar74 = (context->scene->geometries).items[local_530].ptr;
                  if ((pGVar74->mask & (ray->super_RayK<1>).mask) != 0) {
                    uVar77 = (uint)uVar81;
                    auVar88 = vcvtsi2ss_avx512f(auVar84,(int)lVar76);
                    fVar165 = auVar88._0_4_;
                    local_200[0] = (fVar165 + local_2c0._0_4_ + 0.0) * local_100;
                    local_200[1] = (fVar165 + local_2c0._4_4_ + 1.0) * fStack_fc;
                    local_200[2] = (fVar165 + local_2c0._8_4_ + 2.0) * fStack_f8;
                    local_200[3] = (fVar165 + local_2c0._12_4_ + 3.0) * fStack_f4;
                    fStack_1f0 = (fVar165 + local_2c0._16_4_ + 4.0) * fStack_f0;
                    fStack_1ec = (fVar165 + local_2c0._20_4_ + 5.0) * fStack_ec;
                    fStack_1e8 = (fVar165 + local_2c0._24_4_ + 6.0) * fStack_e8;
                    fStack_1e4 = fVar165 + local_2c0._28_4_ + 7.0;
                    local_1e0 = local_2a0;
                    local_1c0 = local_280;
                    auVar150._8_4_ = 0x7f800000;
                    auVar150._0_8_ = 0x7f8000007f800000;
                    auVar150._12_4_ = 0x7f800000;
                    auVar150._16_4_ = 0x7f800000;
                    auVar150._20_4_ = 0x7f800000;
                    auVar150._24_4_ = 0x7f800000;
                    auVar150._28_4_ = 0x7f800000;
                    auVar108 = vblendmps_avx512vl(auVar150,local_280);
                    auVar131._0_4_ =
                         (uint)(bVar80 & 1) * auVar108._0_4_ |
                         (uint)!(bool)(bVar80 & 1) * 0x7f800000;
                    bVar12 = (bool)((byte)(uVar81 >> 1) & 1);
                    auVar131._4_4_ = (uint)bVar12 * auVar108._4_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)((byte)(uVar81 >> 2) & 1);
                    auVar131._8_4_ = (uint)bVar12 * auVar108._8_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)((byte)(uVar81 >> 3) & 1);
                    auVar131._12_4_ = (uint)bVar12 * auVar108._12_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)((byte)(uVar81 >> 4) & 1);
                    auVar131._16_4_ = (uint)bVar12 * auVar108._16_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)((byte)(uVar81 >> 5) & 1);
                    auVar131._20_4_ = (uint)bVar12 * auVar108._20_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)((byte)(uVar81 >> 6) & 1);
                    auVar131._24_4_ = (uint)bVar12 * auVar108._24_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = SUB81(uVar81 >> 7,0);
                    auVar131._28_4_ = (uint)bVar12 * auVar108._28_4_ | (uint)!bVar12 * 0x7f800000;
                    auVar108 = vshufps_avx(auVar131,auVar131,0xb1);
                    auVar108 = vminps_avx(auVar131,auVar108);
                    auVar109 = vshufpd_avx(auVar108,auVar108,5);
                    auVar108 = vminps_avx(auVar108,auVar109);
                    auVar109 = vpermpd_avx2(auVar108,0x4e);
                    auVar108 = vminps_avx(auVar108,auVar109);
                    uVar156 = vcmpps_avx512vl(auVar131,auVar108,0);
                    if (((byte)uVar156 & bVar80) != 0) {
                      uVar77 = (uint)((byte)uVar156 & bVar80);
                    }
                    uVar73 = 0;
                    for (; (uVar77 & 1) == 0; uVar77 = uVar77 >> 1 | 0x80000000) {
                      uVar73 = uVar73 + 1;
                    }
                    uVar71 = (ulong)uVar73;
                    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                       (pGVar74->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                      local_440 = ZEXT432((uint)(ray->super_RayK<1>).tfar);
                      local_460 = local_280;
                      local_468 = pGVar74;
                      do {
                        local_494 = local_200[uVar71];
                        local_490 = *(undefined4 *)(local_1e0 + uVar71 * 4);
                        (ray->super_RayK<1>).tfar = *(float *)(local_1c0 + uVar71 * 4);
                        local_510.context = context->user;
                        fVar165 = 1.0 - local_494;
                        auVar34._8_4_ = 0x80000000;
                        auVar34._0_8_ = 0x8000000080000000;
                        auVar34._12_4_ = 0x80000000;
                        auVar85 = vxorps_avx512vl(ZEXT416((uint)fVar165),auVar34);
                        auVar88 = ZEXT416((uint)(local_494 * fVar165 * 4.0));
                        auVar89 = vfnmsub213ss_fma(ZEXT416((uint)local_494),ZEXT416((uint)local_494)
                                                   ,auVar88);
                        auVar88 = vfmadd213ss_fma(ZEXT416((uint)fVar165),ZEXT416((uint)fVar165),
                                                  auVar88);
                        fVar165 = fVar165 * auVar85._0_4_ * 0.5;
                        fVar153 = auVar89._0_4_ * 0.5;
                        auVar201 = ZEXT464((uint)fVar153);
                        fVar154 = auVar88._0_4_ * 0.5;
                        fVar155 = local_494 * local_494 * 0.5;
                        auVar190._0_4_ = fVar155 * (float)local_4e0._0_4_;
                        auVar190._4_4_ = fVar155 * (float)local_4e0._4_4_;
                        auVar190._8_4_ = fVar155 * (float)uStack_4d8;
                        auVar190._12_4_ = fVar155 * uStack_4d8._4_4_;
                        auVar173._4_4_ = fVar154;
                        auVar173._0_4_ = fVar154;
                        auVar173._8_4_ = fVar154;
                        auVar173._12_4_ = fVar154;
                        auVar88 = vfmadd132ps_fma(auVar173,auVar190,local_4d0);
                        auVar191._4_4_ = fVar153;
                        auVar191._0_4_ = fVar153;
                        auVar191._8_4_ = fVar153;
                        auVar191._12_4_ = fVar153;
                        auVar88 = vfmadd132ps_fma(auVar191,auVar88,local_4c0);
                        auVar198 = ZEXT1664(auVar88);
                        auVar174._4_4_ = fVar165;
                        auVar174._0_4_ = fVar165;
                        auVar174._8_4_ = fVar165;
                        auVar174._12_4_ = fVar165;
                        auVar89 = vfmadd132ps_fma(auVar174,auVar88,local_4b0);
                        local_4a0 = vmovlps_avx(auVar89);
                        local_498 = vextractps_avx(auVar89,2);
                        local_48c = (int)local_528;
                        local_488 = (int)local_530;
                        local_484 = (local_510.context)->instID[0];
                        local_480 = (local_510.context)->instPrimID[0];
                        local_53c = -1;
                        local_510.valid = &local_53c;
                        local_510.geometryUserPtr = pGVar74->userPtr;
                        local_510.ray = (RTCRayN *)ray;
                        local_510.hit = (RTCHitN *)&local_4a0;
                        local_510.N = 1;
                        if (pGVar74->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01bb15a6:
                          p_Var11 = context->args->filter;
                          if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar74->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar198 = ZEXT1664(auVar198._0_16_);
                            auVar201 = ZEXT1664(auVar201._0_16_);
                            (*p_Var11)(&local_510);
                            auVar207 = ZEXT3264(local_460);
                            context = local_538;
                            pGVar74 = local_468;
                            if (*local_510.valid == 0) goto LAB_01bb1648;
                          }
                          (((Vec3f *)((long)local_510.ray + 0x30))->field_0).components[0] =
                               *(float *)local_510.hit;
                          (((Vec3f *)((long)local_510.ray + 0x30))->field_0).field_0.y =
                               *(float *)(local_510.hit + 4);
                          (((Vec3f *)((long)local_510.ray + 0x30))->field_0).field_0.z =
                               *(float *)(local_510.hit + 8);
                          *(float *)((long)local_510.ray + 0x3c) = *(float *)(local_510.hit + 0xc);
                          *(float *)((long)local_510.ray + 0x40) = *(float *)(local_510.hit + 0x10);
                          *(float *)((long)local_510.ray + 0x44) = *(float *)(local_510.hit + 0x14);
                          *(float *)((long)local_510.ray + 0x48) = *(float *)(local_510.hit + 0x18);
                          *(float *)((long)local_510.ray + 0x4c) = *(float *)(local_510.hit + 0x1c);
                          *(float *)((long)local_510.ray + 0x50) = *(float *)(local_510.hit + 0x20);
                        }
                        else {
                          auVar198 = ZEXT1664(auVar88);
                          auVar201 = ZEXT464((uint)fVar153);
                          (*pGVar74->intersectionFilterN)(&local_510);
                          auVar207 = ZEXT3264(local_460);
                          context = local_538;
                          pGVar74 = local_468;
                          if (*local_510.valid != 0) goto LAB_01bb15a6;
LAB_01bb1648:
                          (ray->super_RayK<1>).tfar = (float)local_440._0_4_;
                          context = local_538;
                          pGVar74 = local_468;
                        }
                        bVar80 = ~(byte)(1 << ((uint)uVar71 & 0x1f)) & (byte)uVar81;
                        fVar165 = (ray->super_RayK<1>).tfar;
                        auVar43._4_4_ = fVar165;
                        auVar43._0_4_ = fVar165;
                        auVar43._8_4_ = fVar165;
                        auVar43._12_4_ = fVar165;
                        auVar43._16_4_ = fVar165;
                        auVar43._20_4_ = fVar165;
                        auVar43._24_4_ = fVar165;
                        auVar43._28_4_ = fVar165;
                        uVar156 = vcmpps_avx512vl(auVar207._0_32_,auVar43,2);
                        if ((bVar80 & (byte)uVar156) == 0) goto LAB_01bb16eb;
                        local_440 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
                        bVar80 = bVar80 & (byte)uVar156;
                        uVar77 = (uint)bVar80;
                        uVar81 = (ulong)uVar77;
                        auVar151._8_4_ = 0x7f800000;
                        auVar151._0_8_ = 0x7f8000007f800000;
                        auVar151._12_4_ = 0x7f800000;
                        auVar151._16_4_ = 0x7f800000;
                        auVar151._20_4_ = 0x7f800000;
                        auVar151._24_4_ = 0x7f800000;
                        auVar151._28_4_ = 0x7f800000;
                        auVar108 = vblendmps_avx512vl(auVar151,auVar207._0_32_);
                        auVar132._0_4_ =
                             (uint)(bVar80 & 1) * auVar108._0_4_ |
                             (uint)!(bool)(bVar80 & 1) * 0x7f800000;
                        bVar12 = (bool)(bVar80 >> 1 & 1);
                        auVar132._4_4_ = (uint)bVar12 * auVar108._4_4_ | (uint)!bVar12 * 0x7f800000;
                        bVar12 = (bool)(bVar80 >> 2 & 1);
                        auVar132._8_4_ = (uint)bVar12 * auVar108._8_4_ | (uint)!bVar12 * 0x7f800000;
                        bVar12 = (bool)(bVar80 >> 3 & 1);
                        auVar132._12_4_ =
                             (uint)bVar12 * auVar108._12_4_ | (uint)!bVar12 * 0x7f800000;
                        bVar12 = (bool)(bVar80 >> 4 & 1);
                        auVar132._16_4_ =
                             (uint)bVar12 * auVar108._16_4_ | (uint)!bVar12 * 0x7f800000;
                        bVar12 = (bool)(bVar80 >> 5 & 1);
                        auVar132._20_4_ =
                             (uint)bVar12 * auVar108._20_4_ | (uint)!bVar12 * 0x7f800000;
                        bVar12 = (bool)(bVar80 >> 6 & 1);
                        auVar132._24_4_ =
                             (uint)bVar12 * auVar108._24_4_ | (uint)!bVar12 * 0x7f800000;
                        auVar132._28_4_ =
                             (uint)(bVar80 >> 7) * auVar108._28_4_ |
                             (uint)!(bool)(bVar80 >> 7) * 0x7f800000;
                        auVar108 = vshufps_avx(auVar132,auVar132,0xb1);
                        auVar108 = vminps_avx(auVar132,auVar108);
                        auVar109 = vshufpd_avx(auVar108,auVar108,5);
                        auVar108 = vminps_avx(auVar108,auVar109);
                        auVar109 = vpermpd_avx2(auVar108,0x4e);
                        auVar108 = vminps_avx(auVar108,auVar109);
                        uVar156 = vcmpps_avx512vl(auVar132,auVar108,0);
                        bVar80 = (byte)uVar156 & bVar80;
                        if (bVar80 != 0) {
                          uVar77 = (uint)bVar80;
                        }
                        uVar73 = 0;
                        for (; (uVar77 & 1) == 0; uVar77 = uVar77 >> 1 | 0x80000000) {
                          uVar73 = uVar73 + 1;
                        }
                        uVar71 = (ulong)uVar73;
                      } while( true );
                    }
                    fVar165 = local_200[uVar71];
                    fVar153 = *(float *)(local_1e0 + uVar71 * 4);
                    fVar154 = 1.0 - fVar165;
                    auVar33._8_4_ = 0x80000000;
                    auVar33._0_8_ = 0x8000000080000000;
                    auVar33._12_4_ = 0x80000000;
                    auVar85 = vxorps_avx512vl(ZEXT416((uint)fVar154),auVar33);
                    auVar88 = ZEXT416((uint)(fVar165 * fVar154 * 4.0));
                    auVar89 = vfnmsub213ss_fma(ZEXT416((uint)fVar165),ZEXT416((uint)fVar165),auVar88
                                              );
                    auVar88 = vfmadd213ss_fma(ZEXT416((uint)fVar154),ZEXT416((uint)fVar154),auVar88)
                    ;
                    fVar154 = fVar154 * auVar85._0_4_ * 0.5;
                    fVar155 = auVar89._0_4_ * 0.5;
                    auVar201 = ZEXT464((uint)fVar155);
                    fVar210 = auVar88._0_4_ * 0.5;
                    fVar179 = fVar165 * fVar165 * 0.5;
                    auVar188._0_4_ = fVar179 * (float)local_4e0._0_4_;
                    auVar188._4_4_ = fVar179 * (float)local_4e0._4_4_;
                    auVar188._8_4_ = fVar179 * (float)uStack_4d8;
                    auVar188._12_4_ = fVar179 * uStack_4d8._4_4_;
                    auVar171._4_4_ = fVar210;
                    auVar171._0_4_ = fVar210;
                    auVar171._8_4_ = fVar210;
                    auVar171._12_4_ = fVar210;
                    auVar88 = vfmadd132ps_fma(auVar171,auVar188,local_4d0);
                    auVar189._4_4_ = fVar155;
                    auVar189._0_4_ = fVar155;
                    auVar189._8_4_ = fVar155;
                    auVar189._12_4_ = fVar155;
                    auVar88 = vfmadd132ps_fma(auVar189,auVar88,local_4c0);
                    auVar198 = ZEXT1664(auVar88);
                    auVar172._4_4_ = fVar154;
                    auVar172._0_4_ = fVar154;
                    auVar172._8_4_ = fVar154;
                    auVar172._12_4_ = fVar154;
                    (ray->super_RayK<1>).tfar = *(float *)(local_1c0 + uVar71 * 4);
                    auVar88 = vfmadd132ps_fma(auVar172,auVar88,local_4b0);
                    uVar156 = vmovlps_avx(auVar88);
                    *(undefined8 *)&(ray->Ng).field_0 = uVar156;
                    fVar154 = (float)vextractps_avx(auVar88,2);
                    (ray->Ng).field_0.field_0.z = fVar154;
                    ray->u = fVar165;
                    ray->v = fVar153;
                    ray->primID = (uint)local_528;
                    ray->geomID = (uint)local_530;
                    ray->instID[0] = context->user->instID[0];
                    ray->instPrimID[0] = context->user->instPrimID[0];
                  }
                }
              }
            }
          }
        }
        goto LAB_01bb13fb;
      }
LAB_01bb0aa9:
      fVar165 = (ray->super_RayK<1>).tfar;
      auVar32._4_4_ = fVar165;
      auVar32._0_4_ = fVar165;
      auVar32._8_4_ = fVar165;
      auVar32._12_4_ = fVar165;
      uVar156 = vcmpps_avx512vl(local_190,auVar32,2);
      uVar77 = (uint)uVar79 & (uint)uVar79 + 0xf & (uint)uVar156;
      uVar79 = (ulong)uVar77;
    } while (uVar77 != 0);
  }
  return;
LAB_01bb16eb:
  auVar88 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar222 = ZEXT1664(auVar88);
  auVar223 = ZEXT464(0xbf800000);
  prim = local_520;
LAB_01bb13fb:
  lVar76 = lVar76 + 8;
  if (iVar8 <= (int)lVar76) goto LAB_01bb0aa9;
  goto LAB_01bb0b3b;
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time());

          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }